

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  bool bVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  float fVar97;
  undefined4 uVar98;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  vint4 bi_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vint4 bi;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  vfloat4 a0_3;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  vint4 ai_2;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  vint4 ai_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  float fVar166;
  float fVar167;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar185;
  __m128 a;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar194;
  float fVar204;
  float fVar206;
  float fVar208;
  undefined1 auVar195 [16];
  float fVar205;
  float fVar207;
  float fVar209;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar210;
  float fVar211;
  float fVar220;
  float fVar221;
  vfloat4 a0_1;
  undefined1 auVar212 [16];
  float fVar222;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  vfloat4 a0;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint local_628;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  uint auStack_600 [4];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar26;
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  float fVar132;
  float fVar141;
  
  PVar3 = prim[1];
  uVar21 = (ulong)(byte)PVar3;
  fVar97 = *(float *)(prim + uVar21 * 0x19 + 0x12);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar34 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar33 = vsubps_avx(auVar33,*(undefined1 (*) [16])(prim + uVar21 * 0x19 + 6));
  auVar54._0_4_ = fVar97 * auVar33._0_4_;
  auVar54._4_4_ = fVar97 * auVar33._4_4_;
  auVar54._8_4_ = fVar97 * auVar33._8_4_;
  auVar54._12_4_ = fVar97 * auVar33._12_4_;
  auVar42._0_4_ = fVar97 * auVar34._0_4_;
  auVar42._4_4_ = fVar97 * auVar34._4_4_;
  auVar42._8_4_ = fVar97 * auVar34._8_4_;
  auVar42._12_4_ = fVar97 * auVar34._12_4_;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 4 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 5 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 6 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0xb + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar21 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  uVar32 = (ulong)(uint)((int)(uVar21 * 9) * 2);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 + uVar21 + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  uVar19 = (ulong)(uint)((int)(uVar21 * 5) << 2);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar58._4_4_ = auVar42._0_4_;
  auVar58._0_4_ = auVar42._0_4_;
  auVar58._8_4_ = auVar42._0_4_;
  auVar58._12_4_ = auVar42._0_4_;
  auVar37 = vshufps_avx(auVar42,auVar42,0x55);
  auVar36 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar97 = auVar36._0_4_;
  auVar50._0_4_ = fVar97 * auVar35._0_4_;
  fVar210 = auVar36._4_4_;
  auVar50._4_4_ = fVar210 * auVar35._4_4_;
  fVar194 = auVar36._8_4_;
  auVar50._8_4_ = fVar194 * auVar35._8_4_;
  fVar205 = auVar36._12_4_;
  auVar50._12_4_ = fVar205 * auVar35._12_4_;
  auVar55._0_4_ = auVar41._0_4_ * fVar97;
  auVar55._4_4_ = auVar41._4_4_ * fVar210;
  auVar55._8_4_ = auVar41._8_4_ * fVar194;
  auVar55._12_4_ = auVar41._12_4_ * fVar205;
  auVar43._0_4_ = auVar38._0_4_ * fVar97;
  auVar43._4_4_ = auVar38._4_4_ * fVar210;
  auVar43._8_4_ = auVar38._8_4_ * fVar194;
  auVar43._12_4_ = auVar38._12_4_ * fVar205;
  auVar36 = vfmadd231ps_fma(auVar50,auVar37,auVar34);
  auVar39 = vfmadd231ps_fma(auVar55,auVar37,auVar45);
  auVar37 = vfmadd231ps_fma(auVar43,auVar47,auVar37);
  auVar40 = vfmadd231ps_fma(auVar36,auVar58,auVar33);
  auVar39 = vfmadd231ps_fma(auVar39,auVar58,auVar44);
  auVar42 = vfmadd231ps_fma(auVar37,auVar10,auVar58);
  auVar59._4_4_ = auVar54._0_4_;
  auVar59._0_4_ = auVar54._0_4_;
  auVar59._8_4_ = auVar54._0_4_;
  auVar59._12_4_ = auVar54._0_4_;
  auVar37 = vshufps_avx(auVar54,auVar54,0x55);
  auVar36 = vshufps_avx(auVar54,auVar54,0xaa);
  fVar97 = auVar36._0_4_;
  auVar230._0_4_ = fVar97 * auVar35._0_4_;
  fVar210 = auVar36._4_4_;
  auVar230._4_4_ = fVar210 * auVar35._4_4_;
  fVar194 = auVar36._8_4_;
  auVar230._8_4_ = fVar194 * auVar35._8_4_;
  fVar205 = auVar36._12_4_;
  auVar230._12_4_ = fVar205 * auVar35._12_4_;
  auVar53._0_4_ = auVar41._0_4_ * fVar97;
  auVar53._4_4_ = auVar41._4_4_ * fVar210;
  auVar53._8_4_ = auVar41._8_4_ * fVar194;
  auVar53._12_4_ = auVar41._12_4_ * fVar205;
  auVar52._0_4_ = auVar38._0_4_ * fVar97;
  auVar52._4_4_ = auVar38._4_4_ * fVar210;
  auVar52._8_4_ = auVar38._8_4_ * fVar194;
  auVar52._12_4_ = auVar38._12_4_ * fVar205;
  auVar34 = vfmadd231ps_fma(auVar230,auVar37,auVar34);
  auVar35 = vfmadd231ps_fma(auVar53,auVar37,auVar45);
  auVar45 = vfmadd231ps_fma(auVar52,auVar37,auVar47);
  auVar41 = vfmadd231ps_fma(auVar34,auVar59,auVar33);
  auVar47 = vfmadd231ps_fma(auVar35,auVar59,auVar44);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar33);
  auVar38 = vfmadd231ps_fma(auVar45,auVar59,auVar10);
  auVar34 = vandps_avx512vl(auVar40,auVar33);
  auVar49._8_4_ = 0x219392ef;
  auVar49._0_8_ = 0x219392ef219392ef;
  auVar49._12_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar34,auVar49,1);
  bVar18 = (bool)((byte)uVar32 & 1);
  auVar36._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar40._0_4_;
  bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar40._4_4_;
  bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar40._8_4_;
  bVar18 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar40._12_4_;
  auVar34 = vandps_avx512vl(auVar39,auVar33);
  uVar32 = vcmpps_avx512vl(auVar34,auVar49,1);
  bVar18 = (bool)((byte)uVar32 & 1);
  auVar40._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar39._0_4_;
  bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar39._4_4_;
  bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar39._8_4_;
  bVar18 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar39._12_4_;
  auVar33 = vandps_avx512vl(auVar42,auVar33);
  uVar32 = vcmpps_avx512vl(auVar33,auVar49,1);
  bVar18 = (bool)((byte)uVar32 & 1);
  auVar39._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar42._0_4_;
  bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar42._4_4_;
  bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar42._8_4_;
  bVar18 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar42._12_4_;
  auVar33 = vrcp14ps_avx512vl(auVar36);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar241 = ZEXT1664(auVar34);
  auVar35 = vfnmadd213ps_avx512vl(auVar36,auVar33,auVar34);
  auVar44 = vfmadd132ps_fma(auVar35,auVar33,auVar33);
  auVar33 = vrcp14ps_avx512vl(auVar40);
  auVar35 = vfnmadd213ps_avx512vl(auVar40,auVar33,auVar34);
  auVar45 = vfmadd132ps_fma(auVar35,auVar33,auVar33);
  auVar33 = vrcp14ps_avx512vl(auVar39);
  auVar34 = vfnmadd213ps_avx512vl(auVar39,auVar33,auVar34);
  auVar10 = vfmadd132ps_fma(auVar34,auVar33,auVar33);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar21 * 7 + 6);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar41);
  auVar48._0_4_ = auVar44._0_4_ * auVar33._0_4_;
  auVar48._4_4_ = auVar44._4_4_ * auVar33._4_4_;
  auVar48._8_4_ = auVar44._8_4_ * auVar33._8_4_;
  auVar48._12_4_ = auVar44._12_4_ * auVar33._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar21 * 9 + 6);
  auVar33 = vpmovsxwd_avx(auVar34);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar41);
  auVar36 = vpbroadcastd_avx512vl();
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar34 = vpmovsxwd_avx(auVar35);
  auVar51._0_4_ = auVar44._0_4_ * auVar33._0_4_;
  auVar51._4_4_ = auVar44._4_4_ * auVar33._4_4_;
  auVar51._8_4_ = auVar44._8_4_ * auVar33._8_4_;
  auVar51._12_4_ = auVar44._12_4_ * auVar33._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar21 * -2 + 6);
  auVar33 = vpmovsxwd_avx(auVar44);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar47);
  auVar56._0_4_ = auVar45._0_4_ * auVar33._0_4_;
  auVar56._4_4_ = auVar45._4_4_ * auVar33._4_4_;
  auVar56._8_4_ = auVar45._8_4_ * auVar33._8_4_;
  auVar56._12_4_ = auVar45._12_4_ * auVar33._12_4_;
  auVar33 = vcvtdq2ps_avx(auVar34);
  auVar33 = vsubps_avx(auVar33,auVar47);
  auVar57._0_4_ = auVar45._0_4_ * auVar33._0_4_;
  auVar57._4_4_ = auVar45._4_4_ * auVar33._4_4_;
  auVar57._8_4_ = auVar45._8_4_ * auVar33._8_4_;
  auVar57._12_4_ = auVar45._12_4_ * auVar33._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar19 + uVar21 + 6);
  auVar33 = vpmovsxwd_avx(auVar45);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar38);
  auVar60._0_4_ = auVar10._0_4_ * auVar33._0_4_;
  auVar60._4_4_ = auVar10._4_4_ * auVar33._4_4_;
  auVar60._8_4_ = auVar10._8_4_ * auVar33._8_4_;
  auVar60._12_4_ = auVar10._12_4_ * auVar33._12_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar21 * 0x17 + 6);
  auVar33 = vpmovsxwd_avx(auVar41);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar38);
  auVar46._0_4_ = auVar10._0_4_ * auVar33._0_4_;
  auVar46._4_4_ = auVar10._4_4_ * auVar33._4_4_;
  auVar46._8_4_ = auVar10._8_4_ * auVar33._8_4_;
  auVar46._12_4_ = auVar10._12_4_ * auVar33._12_4_;
  auVar33 = vpminsd_avx(auVar48,auVar51);
  auVar34 = vpminsd_avx(auVar56,auVar57);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar34 = vpminsd_avx(auVar60,auVar46);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar10._4_4_ = uVar98;
  auVar10._0_4_ = uVar98;
  auVar10._8_4_ = uVar98;
  auVar10._12_4_ = uVar98;
  auVar34 = vmaxps_avx512vl(auVar34,auVar10);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar47._8_4_ = 0x3f7ffffa;
  auVar47._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar47._12_4_ = 0x3f7ffffa;
  local_580 = vmulps_avx512vl(auVar33,auVar47);
  auVar33 = vpmaxsd_avx(auVar48,auVar51);
  auVar34 = vpmaxsd_avx(auVar56,auVar57);
  auVar33 = vminps_avx(auVar33,auVar34);
  auVar34 = vpmaxsd_avx(auVar60,auVar46);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar38._4_4_ = uVar98;
  auVar38._0_4_ = uVar98;
  auVar38._8_4_ = uVar98;
  auVar38._12_4_ = uVar98;
  auVar34 = vminps_avx512vl(auVar34,auVar38);
  auVar33 = vminps_avx(auVar33,auVar34);
  auVar37._8_4_ = 0x3f800003;
  auVar37._0_8_ = 0x3f8000033f800003;
  auVar37._12_4_ = 0x3f800003;
  auVar33 = vmulps_avx512vl(auVar33,auVar37);
  uVar11 = vcmpps_avx512vl(local_580,auVar33,2);
  uVar32 = vpcmpgtd_avx512vl(auVar36,_DAT_01f7fcf0);
  uVar32 = ((byte)uVar11 & 0xf) & uVar32;
  if ((char)uVar32 == '\0') {
    return false;
  }
  auVar107 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar107);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar107 = ZEXT1664(auVar33);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar236 = ZEXT1664(auVar33);
  auVar243 = ZEXT464(0x3f800000);
  auVar33 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar242 = ZEXT1664(auVar33);
LAB_01ab44a8:
  lVar23 = 0;
  for (uVar19 = uVar32; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar19 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(prim + lVar23 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar33 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar19);
  lVar23 = uVar19 + 1;
  auVar34 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar23);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar35 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar19);
  auVar44 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar23);
  auVar82 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar82);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar38 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar19),
                       auVar33,auVar37);
  auVar36 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar23),
                       auVar34,auVar37);
  auVar39 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar19 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar35,auVar37);
  auVar40 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar23),
                       auVar44,auVar37);
  auVar46 = ZEXT816(0) << 0x40;
  auVar159._0_4_ = auVar34._0_4_ * 0.0;
  auVar159._4_4_ = auVar34._4_4_ * 0.0;
  auVar159._8_4_ = auVar34._8_4_ * 0.0;
  auVar159._12_4_ = auVar34._12_4_ * 0.0;
  auVar10 = vfmadd231ps_fma(auVar159,auVar36,auVar46);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar38,auVar10);
  auVar168._0_4_ = auVar41._0_4_ + auVar33._0_4_;
  auVar168._4_4_ = auVar41._4_4_ + auVar33._4_4_;
  auVar168._8_4_ = auVar41._8_4_ + auVar33._8_4_;
  auVar168._12_4_ = auVar41._12_4_ + auVar33._12_4_;
  auVar55 = auVar107._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar10,auVar38,auVar55);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar33,auVar55);
  auVar212._0_4_ = auVar44._0_4_ * 0.0;
  auVar212._4_4_ = auVar44._4_4_ * 0.0;
  auVar212._8_4_ = auVar44._8_4_ * 0.0;
  auVar212._12_4_ = auVar44._12_4_ * 0.0;
  auVar10 = vfmadd231ps_fma(auVar212,auVar40,auVar46);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar10);
  auVar223._0_4_ = auVar41._0_4_ + auVar35._0_4_;
  auVar223._4_4_ = auVar41._4_4_ + auVar35._4_4_;
  auVar223._8_4_ = auVar41._8_4_ + auVar35._8_4_;
  auVar223._12_4_ = auVar41._12_4_ + auVar35._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar10,auVar39,auVar55);
  auVar43 = vfnmadd231ps_avx512vl(auVar41,auVar35,auVar55);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar36,auVar34);
  auVar41 = vfmadd231ps_fma(auVar41,auVar38,auVar46);
  auVar47 = vfmadd231ps_fma(auVar41,auVar33,auVar46);
  auVar34 = vmulps_avx512vl(auVar34,auVar55);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar55,auVar36);
  auVar34 = vfmadd231ps_fma(auVar34,auVar46,auVar38);
  auVar38 = vfnmadd231ps_fma(auVar34,auVar46,auVar33);
  auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar40,auVar44);
  auVar33 = vfmadd231ps_fma(auVar33,auVar39,auVar46);
  auVar41 = vfmadd231ps_fma(auVar33,auVar35,auVar46);
  auVar33 = vmulps_avx512vl(auVar44,auVar55);
  auVar33 = vfnmadd231ps_avx512vl(auVar33,auVar55,auVar40);
  auVar33 = vfmadd231ps_fma(auVar33,auVar46,auVar39);
  auVar10 = vfnmadd231ps_fma(auVar33,auVar46,auVar35);
  auVar33 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar34 = vshufps_avx(auVar223,auVar223,0xc9);
  fVar158 = auVar42._0_4_;
  auVar133._0_4_ = fVar158 * auVar34._0_4_;
  fVar166 = auVar42._4_4_;
  auVar133._4_4_ = fVar166 * auVar34._4_4_;
  fVar167 = auVar42._8_4_;
  auVar133._8_4_ = fVar167 * auVar34._8_4_;
  fVar209 = auVar42._12_4_;
  auVar133._12_4_ = fVar209 * auVar34._12_4_;
  auVar34 = vfmsub231ps_fma(auVar133,auVar33,auVar223);
  auVar35 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar142._0_4_ = fVar158 * auVar34._0_4_;
  auVar142._4_4_ = fVar166 * auVar34._4_4_;
  auVar142._8_4_ = fVar167 * auVar34._8_4_;
  auVar142._12_4_ = fVar209 * auVar34._12_4_;
  auVar33 = vfmsub231ps_fma(auVar142,auVar33,auVar43);
  auVar44 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar34 = vshufps_avx(auVar41,auVar41,0xc9);
  fVar97 = auVar38._0_4_;
  auVar186._0_4_ = auVar34._0_4_ * fVar97;
  fVar210 = auVar38._4_4_;
  auVar186._4_4_ = auVar34._4_4_ * fVar210;
  fVar194 = auVar38._8_4_;
  auVar186._8_4_ = auVar34._8_4_ * fVar194;
  fVar205 = auVar38._12_4_;
  auVar186._12_4_ = auVar34._12_4_ * fVar205;
  auVar34 = vfmsub231ps_fma(auVar186,auVar33,auVar41);
  auVar41 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar187._0_4_ = auVar34._0_4_ * fVar97;
  auVar187._4_4_ = auVar34._4_4_ * fVar210;
  auVar187._8_4_ = auVar34._8_4_ * fVar194;
  auVar187._12_4_ = auVar34._12_4_ * fVar205;
  auVar33 = vfmsub231ps_fma(auVar187,auVar33,auVar10);
  auVar10 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vdpps_avx(auVar35,auVar35,0x7f);
  fVar207 = auVar33._0_4_;
  auVar188._4_12_ = ZEXT812(0) << 0x20;
  auVar188._0_4_ = fVar207;
  auVar34 = vrsqrt14ss_avx512f(auVar46,auVar188);
  auVar36 = vmulss_avx512f(auVar34,ZEXT416(0x3fc00000));
  auVar39 = vmulss_avx512f(auVar33,ZEXT416(0x3f000000));
  fVar132 = auVar34._0_4_;
  fVar141 = auVar36._0_4_ - auVar39._0_4_ * fVar132 * fVar132 * fVar132;
  fVar211 = fVar141 * auVar35._0_4_;
  fVar220 = fVar141 * auVar35._4_4_;
  fVar221 = fVar141 * auVar35._8_4_;
  fVar222 = fVar141 * auVar35._12_4_;
  auVar34 = vdpps_avx(auVar35,auVar44,0x7f);
  auVar143._0_4_ = fVar207 * auVar44._0_4_;
  auVar143._4_4_ = fVar207 * auVar44._4_4_;
  auVar143._8_4_ = fVar207 * auVar44._8_4_;
  auVar143._12_4_ = fVar207 * auVar44._12_4_;
  fVar207 = auVar34._0_4_;
  auVar134._0_4_ = fVar207 * auVar35._0_4_;
  auVar134._4_4_ = fVar207 * auVar35._4_4_;
  auVar134._8_4_ = fVar207 * auVar35._8_4_;
  auVar134._12_4_ = fVar207 * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar143,auVar134);
  auVar34 = vrcp14ss_avx512f(auVar46,auVar188);
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar34,ZEXT416(0x40000000));
  fVar207 = auVar34._0_4_ * auVar33._0_4_;
  auVar33 = vdpps_avx(auVar41,auVar41,0x7f);
  fVar132 = auVar33._0_4_;
  auVar135._4_12_ = ZEXT812(0) << 0x20;
  auVar135._0_4_ = fVar132;
  auVar34 = vrsqrt14ss_avx512f(auVar46,auVar135);
  auVar44 = vmulss_avx512f(auVar34,ZEXT416(0x3fc00000));
  auVar36 = vmulss_avx512f(auVar33,ZEXT416(0x3f000000));
  fVar185 = auVar34._0_4_;
  fVar185 = auVar44._0_4_ - auVar36._0_4_ * fVar185 * fVar185 * fVar185;
  fVar193 = fVar185 * auVar41._0_4_;
  fVar204 = fVar185 * auVar41._4_4_;
  fVar206 = fVar185 * auVar41._8_4_;
  fVar208 = fVar185 * auVar41._12_4_;
  auVar34 = vdpps_avx(auVar41,auVar10,0x7f);
  auVar112._0_4_ = fVar132 * auVar10._0_4_;
  auVar112._4_4_ = fVar132 * auVar10._4_4_;
  auVar112._8_4_ = fVar132 * auVar10._8_4_;
  auVar112._12_4_ = fVar132 * auVar10._12_4_;
  fVar132 = auVar34._0_4_;
  auVar99._0_4_ = fVar132 * auVar41._0_4_;
  auVar99._4_4_ = fVar132 * auVar41._4_4_;
  auVar99._8_4_ = fVar132 * auVar41._8_4_;
  auVar99._12_4_ = fVar132 * auVar41._12_4_;
  auVar44 = vsubps_avx(auVar112,auVar99);
  auVar34 = vrcp14ss_avx512f(auVar46,auVar135);
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar34,ZEXT416(0x40000000));
  fVar132 = auVar34._0_4_ * auVar33._0_4_;
  auVar33 = vshufps_avx(auVar168,auVar168,0xff);
  auVar136._0_4_ = fVar211 * auVar33._0_4_;
  auVar136._4_4_ = fVar220 * auVar33._4_4_;
  auVar136._8_4_ = fVar221 * auVar33._8_4_;
  auVar136._12_4_ = fVar222 * auVar33._12_4_;
  local_500 = vsubps_avx(auVar168,auVar136);
  auVar34 = vshufps_avx(auVar42,auVar42,0xff);
  auVar113._0_4_ = fVar211 * auVar34._0_4_ + auVar33._0_4_ * fVar141 * auVar35._0_4_ * fVar207;
  auVar113._4_4_ = fVar220 * auVar34._4_4_ + auVar33._4_4_ * fVar141 * auVar35._4_4_ * fVar207;
  auVar113._8_4_ = fVar221 * auVar34._8_4_ + auVar33._8_4_ * fVar141 * auVar35._8_4_ * fVar207;
  auVar113._12_4_ = fVar222 * auVar34._12_4_ + auVar33._12_4_ * fVar141 * auVar35._12_4_ * fVar207;
  auVar35 = vsubps_avx(auVar42,auVar113);
  local_510._0_4_ = auVar168._0_4_ + auVar136._0_4_;
  local_510._4_4_ = auVar168._4_4_ + auVar136._4_4_;
  fStack_508 = auVar168._8_4_ + auVar136._8_4_;
  fStack_504 = auVar168._12_4_ + auVar136._12_4_;
  auVar114._0_4_ = fVar158 + auVar113._0_4_;
  auVar114._4_4_ = fVar166 + auVar113._4_4_;
  auVar114._8_4_ = fVar167 + auVar113._8_4_;
  auVar114._12_4_ = fVar209 + auVar113._12_4_;
  auVar33 = vshufps_avx(auVar47,auVar47,0xff);
  auVar144._0_4_ = fVar193 * auVar33._0_4_;
  auVar144._4_4_ = fVar204 * auVar33._4_4_;
  auVar144._8_4_ = fVar206 * auVar33._8_4_;
  auVar144._12_4_ = fVar208 * auVar33._12_4_;
  local_520 = vsubps_avx(auVar47,auVar144);
  auVar34 = vshufps_avx(auVar38,auVar38,0xff);
  auVar100._0_4_ = fVar193 * auVar34._0_4_ + auVar33._0_4_ * fVar185 * auVar44._0_4_ * fVar132;
  auVar100._4_4_ = fVar204 * auVar34._4_4_ + auVar33._4_4_ * fVar185 * auVar44._4_4_ * fVar132;
  auVar100._8_4_ = fVar206 * auVar34._8_4_ + auVar33._8_4_ * fVar185 * auVar44._8_4_ * fVar132;
  auVar100._12_4_ = fVar208 * auVar34._12_4_ + auVar33._12_4_ * fVar185 * auVar44._12_4_ * fVar132;
  auVar33 = vsubps_avx(auVar38,auVar100);
  _local_530 = vaddps_avx512vl(auVar47,auVar144);
  auVar101._0_4_ = fVar97 + auVar100._0_4_;
  auVar101._4_4_ = fVar210 + auVar100._4_4_;
  auVar101._8_4_ = fVar194 + auVar100._8_4_;
  auVar101._12_4_ = fVar205 + auVar100._12_4_;
  auVar34 = vmulps_avx512vl(auVar35,auVar37);
  local_540 = vaddps_avx512vl(local_500,auVar34);
  auVar33 = vmulps_avx512vl(auVar33,auVar37);
  local_550 = vsubps_avx512vl(local_520,auVar33);
  auVar33 = vmulps_avx512vl(auVar114,auVar37);
  _local_560 = vaddps_avx512vl(_local_510,auVar33);
  auVar33 = vmulps_avx512vl(auVar101,auVar37);
  _local_570 = vsubps_avx512vl(_local_530,auVar33);
  local_480 = vsubps_avx(local_500,auVar45);
  uVar98 = local_480._0_4_;
  auVar108._4_4_ = uVar98;
  auVar108._0_4_ = uVar98;
  auVar108._8_4_ = uVar98;
  auVar108._12_4_ = uVar98;
  auVar33 = vshufps_avx(local_480,local_480,0x55);
  auVar34 = vshufps_avx(local_480,local_480,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar97 = pre->ray_space[k].vz.field_0.m128[0];
  fVar210 = pre->ray_space[k].vz.field_0.m128[1];
  fVar194 = pre->ray_space[k].vz.field_0.m128[2];
  fVar205 = pre->ray_space[k].vz.field_0.m128[3];
  auVar102._0_4_ = fVar97 * auVar34._0_4_;
  auVar102._4_4_ = fVar210 * auVar34._4_4_;
  auVar102._8_4_ = fVar194 * auVar34._8_4_;
  auVar102._12_4_ = fVar205 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar2,auVar33);
  auVar47 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar108);
  local_490 = vsubps_avx512vl(local_540,auVar45);
  uVar98 = local_490._0_4_;
  auVar115._4_4_ = uVar98;
  auVar115._0_4_ = uVar98;
  auVar115._8_4_ = uVar98;
  auVar115._12_4_ = uVar98;
  auVar33 = vshufps_avx(local_490,local_490,0x55);
  auVar34 = vshufps_avx(local_490,local_490,0xaa);
  auVar109._0_4_ = fVar97 * auVar34._0_4_;
  auVar109._4_4_ = fVar210 * auVar34._4_4_;
  auVar109._8_4_ = fVar194 * auVar34._8_4_;
  auVar109._12_4_ = fVar205 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar2,auVar33);
  auVar38 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar115);
  local_4a0 = vsubps_avx512vl(local_550,auVar45);
  uVar98 = local_4a0._0_4_;
  auVar116._4_4_ = uVar98;
  auVar116._0_4_ = uVar98;
  auVar116._8_4_ = uVar98;
  auVar116._12_4_ = uVar98;
  auVar33 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar34 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar169._0_4_ = auVar34._0_4_ * fVar97;
  auVar169._4_4_ = auVar34._4_4_ * fVar210;
  auVar169._8_4_ = auVar34._8_4_ * fVar194;
  auVar169._12_4_ = auVar34._12_4_ * fVar205;
  auVar33 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar2,auVar33);
  auVar37 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar116);
  local_4b0 = vsubps_avx(local_520,auVar45);
  uVar98 = local_4b0._0_4_;
  auVar117._4_4_ = uVar98;
  auVar117._0_4_ = uVar98;
  auVar117._8_4_ = uVar98;
  auVar117._12_4_ = uVar98;
  auVar33 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar34 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar175._0_4_ = auVar34._0_4_ * fVar97;
  auVar175._4_4_ = auVar34._4_4_ * fVar210;
  auVar175._8_4_ = auVar34._8_4_ * fVar194;
  auVar175._12_4_ = auVar34._12_4_ * fVar205;
  auVar33 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar2,auVar33);
  auVar36 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar117);
  local_4c0 = vsubps_avx(_local_510,auVar45);
  uVar98 = local_4c0._0_4_;
  auVar118._4_4_ = uVar98;
  auVar118._0_4_ = uVar98;
  auVar118._8_4_ = uVar98;
  auVar118._12_4_ = uVar98;
  auVar33 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar34 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar189._0_4_ = auVar34._0_4_ * fVar97;
  auVar189._4_4_ = auVar34._4_4_ * fVar210;
  auVar189._8_4_ = auVar34._8_4_ * fVar194;
  auVar189._12_4_ = auVar34._12_4_ * fVar205;
  auVar33 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar2,auVar33);
  auVar39 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar118);
  local_4d0 = vsubps_avx512vl(_local_560,auVar45);
  uVar98 = local_4d0._0_4_;
  auVar119._4_4_ = uVar98;
  auVar119._0_4_ = uVar98;
  auVar119._8_4_ = uVar98;
  auVar119._12_4_ = uVar98;
  auVar33 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar34 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar195._0_4_ = auVar34._0_4_ * fVar97;
  auVar195._4_4_ = auVar34._4_4_ * fVar210;
  auVar195._8_4_ = auVar34._8_4_ * fVar194;
  auVar195._12_4_ = auVar34._12_4_ * fVar205;
  auVar33 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar2,auVar33);
  auVar40 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar119);
  local_4e0 = vsubps_avx512vl(_local_570,auVar45);
  uVar98 = local_4e0._0_4_;
  auVar120._4_4_ = uVar98;
  auVar120._0_4_ = uVar98;
  auVar120._8_4_ = uVar98;
  auVar120._12_4_ = uVar98;
  auVar33 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar34 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar213._0_4_ = auVar34._0_4_ * fVar97;
  auVar213._4_4_ = auVar34._4_4_ * fVar210;
  auVar213._8_4_ = auVar34._8_4_ * fVar194;
  auVar213._12_4_ = auVar34._12_4_ * fVar205;
  auVar33 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar2,auVar33);
  auVar42 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar120);
  local_4f0 = vsubps_avx512vl(_local_530,auVar45);
  uVar98 = local_4f0._0_4_;
  auVar121._4_4_ = uVar98;
  auVar121._0_4_ = uVar98;
  auVar121._8_4_ = uVar98;
  auVar121._12_4_ = uVar98;
  auVar33 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar34 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar145._0_4_ = fVar97 * auVar34._0_4_;
  auVar145._4_4_ = fVar210 * auVar34._4_4_;
  auVar145._8_4_ = fVar194 * auVar34._8_4_;
  auVar145._12_4_ = fVar205 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar145,(undefined1  [16])aVar2,auVar33);
  auVar43 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar121);
  auVar35 = vmovlhps_avx(auVar47,auVar39);
  auVar44 = vmovlhps_avx(auVar38,auVar40);
  auVar41 = vmovlhps_avx512f(auVar37,auVar42);
  auVar10 = vmovlhps_avx512f(auVar36,auVar43);
  auVar34 = vminps_avx(auVar35,auVar44);
  auVar33 = vmaxps_avx(auVar35,auVar44);
  auVar45 = vminps_avx512vl(auVar41,auVar10);
  auVar34 = vminps_avx(auVar34,auVar45);
  auVar45 = vmaxps_avx512vl(auVar41,auVar10);
  auVar33 = vmaxps_avx(auVar33,auVar45);
  auVar45 = vshufpd_avx(auVar34,auVar34,3);
  auVar34 = vminps_avx(auVar34,auVar45);
  auVar45 = vshufpd_avx(auVar33,auVar33,3);
  auVar33 = vmaxps_avx(auVar33,auVar45);
  auVar34 = vandps_avx512vl(auVar34,auVar240._0_16_);
  auVar33 = vandps_avx512vl(auVar33,auVar240._0_16_);
  auVar33 = vmaxps_avx(auVar34,auVar33);
  auVar34 = vmovshdup_avx(auVar33);
  auVar33 = vmaxss_avx(auVar34,auVar33);
  local_628 = (uint)uVar32 + 0xf;
  fVar97 = auVar33._0_4_ * 9.536743e-07;
  auVar34 = vmovddup_avx512vl(auVar47);
  auVar45 = vmovddup_avx512vl(auVar38);
  auVar170._0_8_ = auVar37._0_8_;
  auVar170._8_8_ = auVar170._0_8_;
  auVar176._0_8_ = auVar36._0_8_;
  auVar176._8_8_ = auVar176._0_8_;
  local_440 = vbroadcastss_avx512vl(ZEXT416((uint)fVar97));
  auVar33 = vxorps_avx512vl(local_440._0_16_,auVar236._0_16_);
  local_3c0 = auVar33._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  bVar18 = false;
  uVar19 = 0;
  uVar27 = *(uint *)(ray + k * 4 + 0xc0);
  local_450 = vsubps_avx(auVar44,auVar35);
  local_460 = vsubps_avx512vl(auVar41,auVar44);
  local_470 = vsubps_avx512vl(auVar10,auVar41);
  local_590 = vsubps_avx(_local_510,local_500);
  local_5a0 = vsubps_avx512vl(_local_560,local_540);
  local_5b0 = vsubps_avx512vl(_local_570,local_550);
  _local_5c0 = vsubps_avx512vl(_local_530,local_520);
  auVar107 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar107);
  auVar33 = ZEXT816(0x3f80000000000000);
  auVar82._32_32_ = auVar107._32_32_;
  auVar110 = auVar33;
LAB_01ab4ba5:
  do {
    auVar47 = vshufps_avx(auVar110,auVar110,0x50);
    auVar227._8_4_ = 0x3f800000;
    auVar227._0_8_ = 0x3f8000003f800000;
    auVar227._12_4_ = 0x3f800000;
    auVar81._16_4_ = 0x3f800000;
    auVar81._0_16_ = auVar227;
    auVar81._20_4_ = 0x3f800000;
    auVar81._24_4_ = 0x3f800000;
    auVar81._28_4_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar227,auVar47);
    fVar210 = auVar47._0_4_;
    fVar132 = auVar39._0_4_;
    auVar137._0_4_ = fVar132 * fVar210;
    fVar194 = auVar47._4_4_;
    fVar141 = auVar39._4_4_;
    auVar137._4_4_ = fVar141 * fVar194;
    fVar205 = auVar47._8_4_;
    auVar137._8_4_ = fVar132 * fVar205;
    fVar207 = auVar47._12_4_;
    auVar137._12_4_ = fVar141 * fVar207;
    fVar185 = auVar40._0_4_;
    auVar146._0_4_ = fVar185 * fVar210;
    fVar158 = auVar40._4_4_;
    auVar146._4_4_ = fVar158 * fVar194;
    auVar146._8_4_ = fVar185 * fVar205;
    auVar146._12_4_ = fVar158 * fVar207;
    fVar166 = auVar42._0_4_;
    auVar153._0_4_ = fVar166 * fVar210;
    fVar167 = auVar42._4_4_;
    auVar153._4_4_ = fVar167 * fVar194;
    auVar153._8_4_ = fVar166 * fVar205;
    auVar153._12_4_ = fVar167 * fVar207;
    fVar206 = auVar43._0_4_;
    auVar122._0_4_ = fVar206 * fVar210;
    fVar208 = auVar43._4_4_;
    auVar122._4_4_ = fVar208 * fVar194;
    auVar122._8_4_ = fVar206 * fVar205;
    auVar122._12_4_ = fVar208 * fVar207;
    auVar36 = vfmadd231ps_avx512vl(auVar137,auVar38,auVar34);
    auVar46 = vfmadd231ps_avx512vl(auVar146,auVar38,auVar45);
    auVar37 = vfmadd231ps_fma(auVar153,auVar38,auVar170);
    auVar38 = vfmadd231ps_fma(auVar122,auVar176,auVar38);
    auVar47 = vmovshdup_avx(auVar33);
    fVar194 = auVar33._0_4_;
    fVar210 = (auVar47._0_4_ - fVar194) * 0.04761905;
    auVar75._4_4_ = fVar194;
    auVar75._0_4_ = fVar194;
    auVar75._8_4_ = fVar194;
    auVar75._12_4_ = fVar194;
    auVar75._16_4_ = fVar194;
    auVar75._20_4_ = fVar194;
    auVar75._24_4_ = fVar194;
    auVar75._28_4_ = fVar194;
    auVar65._0_8_ = auVar47._0_8_;
    auVar65._8_8_ = auVar65._0_8_;
    auVar65._16_8_ = auVar65._0_8_;
    auVar65._24_8_ = auVar65._0_8_;
    auVar78 = vsubps_avx(auVar65,auVar75);
    uVar98 = auVar36._0_4_;
    auVar79._4_4_ = uVar98;
    auVar79._0_4_ = uVar98;
    auVar79._8_4_ = uVar98;
    auVar79._12_4_ = uVar98;
    auVar79._16_4_ = uVar98;
    auVar79._20_4_ = uVar98;
    auVar79._24_4_ = uVar98;
    auVar79._28_4_ = uVar98;
    auVar67._8_4_ = 1;
    auVar67._0_8_ = 0x100000001;
    auVar67._12_4_ = 1;
    auVar67._16_4_ = 1;
    auVar67._20_4_ = 1;
    auVar67._24_4_ = 1;
    auVar67._28_4_ = 1;
    auVar77 = ZEXT1632(auVar36);
    auVar76 = vpermps_avx2(auVar67,auVar77);
    auVar61 = vbroadcastss_avx512vl(auVar46);
    auVar71 = ZEXT1632(auVar46);
    auVar62 = vpermps_avx512vl(auVar67,auVar71);
    auVar63 = vbroadcastss_avx512vl(auVar37);
    auVar72 = ZEXT1632(auVar37);
    auVar64 = vpermps_avx512vl(auVar67,auVar72);
    auVar65 = vbroadcastss_avx512vl(auVar38);
    auVar74 = ZEXT1632(auVar38);
    auVar66 = vpermps_avx512vl(auVar67,auVar74);
    auVar80._4_4_ = fVar210;
    auVar80._0_4_ = fVar210;
    auVar80._8_4_ = fVar210;
    auVar80._12_4_ = fVar210;
    auVar80._16_4_ = fVar210;
    auVar80._20_4_ = fVar210;
    auVar80._24_4_ = fVar210;
    auVar80._28_4_ = fVar210;
    auVar73._8_4_ = 2;
    auVar73._0_8_ = 0x200000002;
    auVar73._12_4_ = 2;
    auVar73._16_4_ = 2;
    auVar73._20_4_ = 2;
    auVar73._24_4_ = 2;
    auVar73._28_4_ = 2;
    auVar67 = vpermps_avx512vl(auVar73,auVar77);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar69 = vpermps_avx512vl(auVar68,auVar77);
    auVar70 = vpermps_avx512vl(auVar73,auVar71);
    auVar71 = vpermps_avx512vl(auVar68,auVar71);
    auVar77 = vpermps_avx2(auVar73,auVar72);
    auVar72 = vpermps_avx512vl(auVar68,auVar72);
    auVar73 = vpermps_avx512vl(auVar73,auVar74);
    auVar68 = vpermps_avx512vl(auVar68,auVar74);
    auVar47 = vfmadd132ps_fma(auVar78,auVar75,_DAT_01faff20);
    auVar78 = vsubps_avx(auVar81,ZEXT1632(auVar47));
    auVar74 = vmulps_avx512vl(auVar61,ZEXT1632(auVar47));
    auVar81 = ZEXT1632(auVar47);
    auVar75 = vmulps_avx512vl(auVar62,auVar81);
    auVar38 = vfmadd231ps_fma(auVar74,auVar78,auVar79);
    auVar37 = vfmadd231ps_fma(auVar75,auVar78,auVar76);
    auVar74 = vmulps_avx512vl(auVar63,auVar81);
    auVar75 = vmulps_avx512vl(auVar64,auVar81);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar78,auVar61);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar78,auVar62);
    auVar61 = vmulps_avx512vl(auVar65,auVar81);
    auVar79 = ZEXT1632(auVar47);
    auVar62 = vmulps_avx512vl(auVar66,auVar79);
    auVar63 = vfmadd231ps_avx512vl(auVar61,auVar78,auVar63);
    auVar64 = vfmadd231ps_avx512vl(auVar62,auVar78,auVar64);
    fVar205 = auVar47._0_4_;
    fVar207 = auVar47._4_4_;
    auVar61._4_4_ = fVar207 * auVar74._4_4_;
    auVar61._0_4_ = fVar205 * auVar74._0_4_;
    fVar209 = auVar47._8_4_;
    auVar61._8_4_ = fVar209 * auVar74._8_4_;
    fVar193 = auVar47._12_4_;
    auVar61._12_4_ = fVar193 * auVar74._12_4_;
    auVar61._16_4_ = auVar74._16_4_ * 0.0;
    auVar61._20_4_ = auVar74._20_4_ * 0.0;
    auVar61._24_4_ = auVar74._24_4_ * 0.0;
    auVar61._28_4_ = fVar194;
    auVar62._4_4_ = fVar207 * auVar75._4_4_;
    auVar62._0_4_ = fVar205 * auVar75._0_4_;
    auVar62._8_4_ = fVar209 * auVar75._8_4_;
    auVar62._12_4_ = fVar193 * auVar75._12_4_;
    auVar62._16_4_ = auVar75._16_4_ * 0.0;
    auVar62._20_4_ = auVar75._20_4_ * 0.0;
    auVar62._24_4_ = auVar75._24_4_ * 0.0;
    auVar62._28_4_ = auVar76._28_4_;
    auVar38 = vfmadd231ps_fma(auVar61,auVar78,ZEXT1632(auVar38));
    auVar37 = vfmadd231ps_fma(auVar62,auVar78,ZEXT1632(auVar37));
    auVar66._0_4_ = fVar205 * auVar63._0_4_;
    auVar66._4_4_ = fVar207 * auVar63._4_4_;
    auVar66._8_4_ = fVar209 * auVar63._8_4_;
    auVar66._12_4_ = fVar193 * auVar63._12_4_;
    auVar66._16_4_ = auVar63._16_4_ * 0.0;
    auVar66._20_4_ = auVar63._20_4_ * 0.0;
    auVar66._24_4_ = auVar63._24_4_ * 0.0;
    auVar66._28_4_ = 0;
    auVar76._4_4_ = fVar207 * auVar64._4_4_;
    auVar76._0_4_ = fVar205 * auVar64._0_4_;
    auVar76._8_4_ = fVar209 * auVar64._8_4_;
    auVar76._12_4_ = fVar193 * auVar64._12_4_;
    auVar76._16_4_ = auVar64._16_4_ * 0.0;
    auVar76._20_4_ = auVar64._20_4_ * 0.0;
    auVar76._24_4_ = auVar64._24_4_ * 0.0;
    auVar76._28_4_ = auVar63._28_4_;
    auVar36 = vfmadd231ps_fma(auVar66,auVar78,auVar74);
    auVar46 = vfmadd231ps_fma(auVar76,auVar78,auVar75);
    auVar63._28_4_ = auVar75._28_4_;
    auVar63._0_28_ =
         ZEXT1628(CONCAT412(fVar193 * auVar46._12_4_,
                            CONCAT48(fVar209 * auVar46._8_4_,
                                     CONCAT44(fVar207 * auVar46._4_4_,fVar205 * auVar46._0_4_))));
    auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar193 * auVar36._12_4_,
                                                 CONCAT48(fVar209 * auVar36._8_4_,
                                                          CONCAT44(fVar207 * auVar36._4_4_,
                                                                   fVar205 * auVar36._0_4_)))),
                              auVar78,ZEXT1632(auVar38));
    auVar57 = vfmadd231ps_fma(auVar63,auVar78,ZEXT1632(auVar37));
    auVar76 = vsubps_avx(ZEXT1632(auVar36),ZEXT1632(auVar38));
    auVar61 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar37));
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar76 = vmulps_avx512vl(auVar76,auVar62);
    auVar61 = vmulps_avx512vl(auVar61,auVar62);
    auVar74._0_4_ = fVar210 * auVar76._0_4_;
    auVar74._4_4_ = fVar210 * auVar76._4_4_;
    auVar74._8_4_ = fVar210 * auVar76._8_4_;
    auVar74._12_4_ = fVar210 * auVar76._12_4_;
    auVar74._16_4_ = fVar210 * auVar76._16_4_;
    auVar74._20_4_ = fVar210 * auVar76._20_4_;
    auVar74._24_4_ = fVar210 * auVar76._24_4_;
    auVar74._28_4_ = 0;
    auVar76 = vmulps_avx512vl(auVar80,auVar61);
    auVar37 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
    auVar61 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01feed00,ZEXT1632(auVar37));
    auVar63 = vpermt2ps_avx512vl(ZEXT1632(auVar57),_DAT_01feed00,ZEXT1632(auVar37));
    auVar127._0_4_ = auVar74._0_4_ + auVar55._0_4_;
    auVar127._4_4_ = auVar74._4_4_ + auVar55._4_4_;
    auVar127._8_4_ = auVar74._8_4_ + auVar55._8_4_;
    auVar127._12_4_ = auVar74._12_4_ + auVar55._12_4_;
    auVar127._16_4_ = auVar74._16_4_ + 0.0;
    auVar127._20_4_ = auVar74._20_4_ + 0.0;
    auVar127._24_4_ = auVar74._24_4_ + 0.0;
    auVar127._28_4_ = 0;
    auVar75 = ZEXT1632(auVar37);
    auVar64 = vpermt2ps_avx512vl(auVar74,_DAT_01feed00,auVar75);
    auVar65 = vaddps_avx512vl(ZEXT1632(auVar57),auVar76);
    auVar66 = vpermt2ps_avx512vl(auVar76,_DAT_01feed00,auVar75);
    auVar76 = vsubps_avx(auVar61,auVar64);
    auVar66 = vsubps_avx512vl(auVar63,auVar66);
    auVar64 = vmulps_avx512vl(auVar70,auVar79);
    auVar74 = vmulps_avx512vl(auVar71,auVar79);
    auVar64 = vfmadd231ps_avx512vl(auVar64,auVar78,auVar67);
    auVar67 = vfmadd231ps_avx512vl(auVar74,auVar78,auVar69);
    auVar69 = vmulps_avx512vl(auVar77,auVar79);
    auVar74 = vmulps_avx512vl(auVar72,auVar79);
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar78,auVar70);
    auVar70 = vfmadd231ps_avx512vl(auVar74,auVar78,auVar71);
    auVar71 = vmulps_avx512vl(auVar73,auVar79);
    auVar68 = vmulps_avx512vl(auVar68,auVar79);
    auVar38 = vfmadd231ps_fma(auVar71,auVar78,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar68,auVar78,auVar72);
    auVar68 = vmulps_avx512vl(auVar79,auVar69);
    auVar73 = ZEXT1632(auVar47);
    auVar71 = vmulps_avx512vl(auVar73,auVar70);
    auVar64 = vfmadd231ps_avx512vl(auVar68,auVar78,auVar64);
    auVar67 = vfmadd231ps_avx512vl(auVar71,auVar78,auVar67);
    auVar77 = vmulps_avx512vl(auVar73,auVar77);
    auVar68 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar193 * auVar38._12_4_,
                                            CONCAT48(fVar209 * auVar38._8_4_,
                                                     CONCAT44(fVar207 * auVar38._4_4_,
                                                              fVar205 * auVar38._0_4_)))),auVar78,
                         auVar69);
    auVar69 = vfmadd231ps_avx512vl(auVar77,auVar78,auVar70);
    auVar77._4_4_ = fVar207 * auVar68._4_4_;
    auVar77._0_4_ = fVar205 * auVar68._0_4_;
    auVar77._8_4_ = fVar209 * auVar68._8_4_;
    auVar77._12_4_ = fVar193 * auVar68._12_4_;
    auVar77._16_4_ = auVar68._16_4_ * 0.0;
    auVar77._20_4_ = auVar68._20_4_ * 0.0;
    auVar77._24_4_ = auVar68._24_4_ * 0.0;
    auVar77._28_4_ = auVar72._28_4_;
    auVar70 = vmulps_avx512vl(auVar73,auVar69);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar78,auVar64);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar67,auVar78);
    auVar78 = vsubps_avx512vl(auVar68,auVar64);
    auVar64 = vsubps_avx512vl(auVar69,auVar67);
    auVar67 = vmulps_avx512vl(auVar78,auVar62);
    auVar62 = vmulps_avx512vl(auVar64,auVar62);
    fVar194 = fVar210 * auVar67._0_4_;
    fVar205 = fVar210 * auVar67._4_4_;
    auVar78._4_4_ = fVar205;
    auVar78._0_4_ = fVar194;
    fVar207 = fVar210 * auVar67._8_4_;
    auVar78._8_4_ = fVar207;
    fVar209 = fVar210 * auVar67._12_4_;
    auVar78._12_4_ = fVar209;
    fVar193 = fVar210 * auVar67._16_4_;
    auVar78._16_4_ = fVar193;
    fVar204 = fVar210 * auVar67._20_4_;
    auVar78._20_4_ = fVar204;
    fVar210 = fVar210 * auVar67._24_4_;
    auVar78._24_4_ = fVar210;
    auVar78._28_4_ = auVar67._28_4_;
    auVar62 = vmulps_avx512vl(auVar80,auVar62);
    auVar68 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar75);
    auVar69 = vpermt2ps_avx512vl(auVar70,_DAT_01feed00,auVar75);
    auVar192._0_4_ = auVar77._0_4_ + fVar194;
    auVar192._4_4_ = auVar77._4_4_ + fVar205;
    auVar192._8_4_ = auVar77._8_4_ + fVar207;
    auVar192._12_4_ = auVar77._12_4_ + fVar209;
    auVar192._16_4_ = auVar77._16_4_ + fVar193;
    auVar192._20_4_ = auVar77._20_4_ + fVar204;
    auVar192._24_4_ = auVar77._24_4_ + fVar210;
    auVar192._28_4_ = auVar77._28_4_ + auVar67._28_4_;
    auVar78 = vpermt2ps_avx512vl(auVar78,_DAT_01feed00,ZEXT1632(auVar37));
    auVar67 = vaddps_avx512vl(auVar70,auVar62);
    auVar62 = vpermt2ps_avx512vl(auVar62,_DAT_01feed00,ZEXT1632(auVar37));
    auVar78 = vsubps_avx(auVar68,auVar78);
    auVar62 = vsubps_avx512vl(auVar69,auVar62);
    auVar140 = ZEXT1632(auVar55);
    auVar64 = vsubps_avx512vl(auVar77,auVar140);
    auVar152 = ZEXT1632(auVar57);
    auVar71 = vsubps_avx512vl(auVar70,auVar152);
    auVar72 = vsubps_avx512vl(auVar68,auVar61);
    auVar64 = vaddps_avx512vl(auVar64,auVar72);
    auVar72 = vsubps_avx512vl(auVar69,auVar63);
    auVar71 = vaddps_avx512vl(auVar71,auVar72);
    auVar72 = vmulps_avx512vl(auVar152,auVar64);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar140,auVar71);
    auVar73 = vmulps_avx512vl(auVar65,auVar64);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar127,auVar71);
    auVar74 = vmulps_avx512vl(auVar66,auVar64);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar76,auVar71);
    auVar75 = vmulps_avx512vl(auVar63,auVar64);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar61,auVar71);
    auVar79 = vmulps_avx512vl(auVar70,auVar64);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar77,auVar71);
    auVar80 = vmulps_avx512vl(auVar67,auVar64);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar192,auVar71);
    auVar81 = vmulps_avx512vl(auVar62,auVar64);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar78,auVar71);
    auVar64 = vmulps_avx512vl(auVar69,auVar64);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar68,auVar71);
    auVar71 = vminps_avx512vl(auVar72,auVar73);
    auVar72 = vmaxps_avx512vl(auVar72,auVar73);
    auVar73 = vminps_avx512vl(auVar74,auVar75);
    auVar71 = vminps_avx512vl(auVar71,auVar73);
    auVar73 = vmaxps_avx512vl(auVar74,auVar75);
    auVar72 = vmaxps_avx512vl(auVar72,auVar73);
    auVar73 = vminps_avx512vl(auVar79,auVar80);
    auVar74 = vmaxps_avx512vl(auVar79,auVar80);
    auVar75 = vminps_avx512vl(auVar81,auVar64);
    auVar73 = vminps_avx512vl(auVar73,auVar75);
    auVar71 = vminps_avx512vl(auVar71,auVar73);
    auVar64 = vmaxps_avx512vl(auVar81,auVar64);
    auVar64 = vmaxps_avx512vl(auVar74,auVar64);
    auVar72 = vmaxps_avx512vl(auVar72,auVar64);
    uVar11 = vcmpps_avx512vl(auVar71,local_440,2);
    auVar64._4_4_ = uStack_3bc;
    auVar64._0_4_ = local_3c0;
    auVar64._8_4_ = uStack_3b8;
    auVar64._12_4_ = uStack_3b4;
    auVar64._16_4_ = uStack_3b0;
    auVar64._20_4_ = uStack_3ac;
    auVar64._24_4_ = uStack_3a8;
    auVar64._28_4_ = uStack_3a4;
    uVar12 = vcmpps_avx512vl(auVar72,auVar64,5);
    bVar24 = (byte)uVar11 & (byte)uVar12 & 0x7f;
    if (bVar24 != 0) {
      auVar71 = vsubps_avx512vl(auVar61,auVar140);
      auVar72 = vsubps_avx512vl(auVar63,auVar152);
      auVar73 = vsubps_avx512vl(auVar68,auVar77);
      auVar71 = vaddps_avx512vl(auVar71,auVar73);
      auVar73 = vsubps_avx512vl(auVar69,auVar70);
      auVar72 = vaddps_avx512vl(auVar72,auVar73);
      auVar73 = vmulps_avx512vl(auVar152,auVar71);
      auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar72,auVar140);
      auVar65 = vmulps_avx512vl(auVar65,auVar71);
      auVar65 = vfnmadd213ps_avx512vl(auVar127,auVar72,auVar65);
      auVar66 = vmulps_avx512vl(auVar66,auVar71);
      auVar66 = vfnmadd213ps_avx512vl(auVar76,auVar72,auVar66);
      auVar76 = vmulps_avx512vl(auVar63,auVar71);
      auVar63 = vfnmadd231ps_avx512vl(auVar76,auVar72,auVar61);
      auVar76 = vmulps_avx512vl(auVar70,auVar71);
      auVar70 = vfnmadd231ps_avx512vl(auVar76,auVar72,auVar77);
      auVar76 = vmulps_avx512vl(auVar67,auVar71);
      auVar67 = vfnmadd213ps_avx512vl(auVar192,auVar72,auVar76);
      auVar76 = vmulps_avx512vl(auVar62,auVar71);
      auVar74 = vfnmadd213ps_avx512vl(auVar78,auVar72,auVar76);
      auVar78 = vmulps_avx512vl(auVar69,auVar71);
      auVar68 = vfnmadd231ps_avx512vl(auVar78,auVar68,auVar72);
      auVar76 = vminps_avx(auVar73,auVar65);
      auVar78 = vmaxps_avx(auVar73,auVar65);
      auVar61 = vminps_avx(auVar66,auVar63);
      auVar61 = vminps_avx(auVar76,auVar61);
      auVar76 = vmaxps_avx(auVar66,auVar63);
      auVar78 = vmaxps_avx(auVar78,auVar76);
      auVar77 = vminps_avx(auVar70,auVar67);
      auVar76 = vmaxps_avx(auVar70,auVar67);
      auVar62 = vminps_avx(auVar74,auVar68);
      auVar77 = vminps_avx(auVar77,auVar62);
      auVar77 = vminps_avx(auVar61,auVar77);
      auVar61 = vmaxps_avx(auVar74,auVar68);
      auVar76 = vmaxps_avx(auVar76,auVar61);
      auVar78 = vmaxps_avx(auVar78,auVar76);
      uVar11 = vcmpps_avx512vl(auVar78,auVar64,5);
      uVar12 = vcmpps_avx512vl(auVar77,local_440,2);
      bVar24 = bVar24 & (byte)uVar11 & (byte)uVar12;
      if (bVar24 != 0) {
        auStack_600[uVar19] = (uint)bVar24;
        uVar11 = vmovlps_avx(auVar33);
        (&uStack_420)[uVar19] = uVar11;
        uVar21 = vmovlps_avx(auVar110);
        auStack_3a0[uVar19] = uVar21;
        uVar19 = (ulong)((int)uVar19 + 1);
      }
    }
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar107 = ZEXT1664(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar236 = ZEXT1664(auVar33);
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar237 = ZEXT3264(auVar78);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar238 = ZEXT1664(auVar33);
    auVar83._32_32_ = auVar82._32_32_;
    auVar83._0_32_ = _DAT_01feed20;
    auVar239 = ZEXT3264(_DAT_01feed20);
LAB_01ab50ae:
    do {
      do {
        if ((int)uVar19 == 0) {
          if (bVar18) {
            return bVar18;
          }
          uVar98 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar16._4_4_ = uVar98;
          auVar16._0_4_ = uVar98;
          auVar16._8_4_ = uVar98;
          auVar16._12_4_ = uVar98;
          uVar11 = vcmpps_avx512vl(local_580,auVar16,2);
          uVar27 = (uint)uVar32 & local_628 & (uint)uVar11;
          uVar32 = (ulong)uVar27;
          if (uVar27 == 0) {
            return bVar18;
          }
          goto LAB_01ab44a8;
        }
        uVar25 = (int)uVar19 - 1;
        uVar26 = (ulong)uVar25;
        uVar5 = auStack_600[uVar26];
        auVar110._8_8_ = 0;
        auVar110._0_8_ = auStack_3a0[uVar26];
        uVar21 = 0;
        for (uVar22 = (ulong)uVar5; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          uVar21 = uVar21 + 1;
        }
        uVar20 = uVar5 - 1 & uVar5;
        bVar30 = uVar20 == 0;
        auStack_600[uVar26] = uVar20;
        if (bVar30) {
          uVar19 = (ulong)uVar25;
        }
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar21;
        auVar33 = vpunpcklqdq_avx(auVar103,ZEXT416((int)uVar21 + 1));
        auVar82._32_32_ = auVar83._32_32_;
        auVar33 = vcvtqq2ps_avx512vl(auVar33);
        auVar33 = vmulps_avx512vl(auVar33,auVar238._0_16_);
        uVar98 = *(undefined4 *)((long)&uStack_420 + uVar26 * 8 + 4);
        auVar13._4_4_ = uVar98;
        auVar13._0_4_ = uVar98;
        auVar13._8_4_ = uVar98;
        auVar13._12_4_ = uVar98;
        auVar47 = vmulps_avx512vl(auVar33,auVar13);
        auVar38 = auVar241._0_16_;
        auVar33 = vsubps_avx512vl(auVar38,auVar33);
        uVar98 = *(undefined4 *)(&uStack_420 + uVar26);
        auVar14._4_4_ = uVar98;
        auVar14._0_4_ = uVar98;
        auVar14._8_4_ = uVar98;
        auVar14._12_4_ = uVar98;
        auVar33 = vfmadd231ps_avx512vl(auVar47,auVar33,auVar14);
        auVar47 = vmovshdup_avx(auVar33);
        fVar210 = auVar47._0_4_ - auVar33._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar210));
        if (uVar5 == 0 || bVar30) goto LAB_01ab4ba5;
        auVar47 = vshufps_avx(auVar110,auVar110,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar210));
        auVar46 = vsubps_avx512vl(auVar38,auVar47);
        fVar194 = auVar47._0_4_;
        auVar147._0_4_ = fVar194 * fVar132;
        fVar205 = auVar47._4_4_;
        auVar147._4_4_ = fVar205 * fVar141;
        fVar207 = auVar47._8_4_;
        auVar147._8_4_ = fVar207 * fVar132;
        fVar209 = auVar47._12_4_;
        auVar147._12_4_ = fVar209 * fVar141;
        auVar154._0_4_ = fVar194 * fVar185;
        auVar154._4_4_ = fVar205 * fVar158;
        auVar154._8_4_ = fVar207 * fVar185;
        auVar154._12_4_ = fVar209 * fVar158;
        auVar160._0_4_ = fVar194 * fVar166;
        auVar160._4_4_ = fVar205 * fVar167;
        auVar160._8_4_ = fVar207 * fVar166;
        auVar160._12_4_ = fVar209 * fVar167;
        auVar128._0_4_ = fVar194 * fVar206;
        auVar128._4_4_ = fVar205 * fVar208;
        auVar128._8_4_ = fVar207 * fVar206;
        auVar128._12_4_ = fVar209 * fVar208;
        auVar47 = vfmadd231ps_fma(auVar147,auVar46,auVar34);
        auVar37 = vfmadd231ps_fma(auVar154,auVar46,auVar45);
        auVar36 = vfmadd231ps_fma(auVar160,auVar46,auVar170);
        auVar46 = vfmadd231ps_fma(auVar128,auVar46,auVar176);
        auVar68._16_16_ = auVar47;
        auVar68._0_16_ = auVar47;
        auVar69._16_16_ = auVar37;
        auVar69._0_16_ = auVar37;
        auVar71._16_16_ = auVar36;
        auVar71._0_16_ = auVar36;
        auVar76 = vpermps_avx512vl(auVar239._0_32_,ZEXT1632(auVar33));
        auVar78 = vsubps_avx(auVar69,auVar68);
        auVar37 = vfmadd213ps_fma(auVar78,auVar76,auVar68);
        auVar78 = vsubps_avx(auVar71,auVar69);
        auVar55 = vfmadd213ps_fma(auVar78,auVar76,auVar69);
        auVar47 = vsubps_avx(auVar46,auVar36);
        auVar70._16_16_ = auVar47;
        auVar70._0_16_ = auVar47;
        auVar47 = vfmadd213ps_fma(auVar70,auVar76,auVar71);
        auVar78 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar37));
        auVar37 = vfmadd213ps_fma(auVar78,auVar76,ZEXT1632(auVar37));
        auVar78 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar55));
        auVar47 = vfmadd213ps_fma(auVar78,auVar76,ZEXT1632(auVar55));
        auVar78 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar37));
        auVar60 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar78,auVar76);
        auVar82._0_32_ = vmulps_avx512vl(auVar78,auVar237._0_32_);
        auVar83._16_48_ = auVar82._16_48_;
        auVar47 = vmulss_avx512f(ZEXT416((uint)fVar210),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar194 = auVar47._0_4_;
        auVar161._0_8_ =
             CONCAT44(auVar60._4_4_ + fVar194 * auVar82._4_4_,
                      auVar60._0_4_ + fVar194 * auVar82._0_4_);
        auVar161._8_4_ = auVar60._8_4_ + fVar194 * auVar82._8_4_;
        auVar161._12_4_ = auVar60._12_4_ + fVar194 * auVar82._12_4_;
        auVar148._0_4_ = fVar194 * auVar82._16_4_;
        auVar148._4_4_ = fVar194 * auVar82._20_4_;
        auVar148._8_4_ = fVar194 * auVar82._24_4_;
        auVar148._12_4_ = fVar194 * auVar82._28_4_;
        auVar54 = vsubps_avx((undefined1  [16])0x0,auVar148);
        auVar55 = vshufpd_avx(auVar60,auVar60,3);
        auVar57 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar47 = vsubps_avx(auVar55,auVar60);
        auVar37 = vsubps_avx(auVar57,(undefined1  [16])0x0);
        auVar177._0_4_ = auVar47._0_4_ + auVar37._0_4_;
        auVar177._4_4_ = auVar47._4_4_ + auVar37._4_4_;
        auVar177._8_4_ = auVar47._8_4_ + auVar37._8_4_;
        auVar177._12_4_ = auVar47._12_4_ + auVar37._12_4_;
        auVar47 = vshufps_avx(auVar60,auVar60,0xb1);
        auVar37 = vshufps_avx(auVar161,auVar161,0xb1);
        auVar36 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar46 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar228._4_4_ = auVar177._0_4_;
        auVar228._0_4_ = auVar177._0_4_;
        auVar228._8_4_ = auVar177._0_4_;
        auVar228._12_4_ = auVar177._0_4_;
        auVar50 = vshufps_avx(auVar177,auVar177,0x55);
        fVar194 = auVar50._0_4_;
        auVar190._0_4_ = auVar47._0_4_ * fVar194;
        fVar205 = auVar50._4_4_;
        auVar190._4_4_ = auVar47._4_4_ * fVar205;
        fVar207 = auVar50._8_4_;
        auVar190._8_4_ = auVar47._8_4_ * fVar207;
        fVar209 = auVar50._12_4_;
        auVar190._12_4_ = auVar47._12_4_ * fVar209;
        auVar196._0_4_ = auVar37._0_4_ * fVar194;
        auVar196._4_4_ = auVar37._4_4_ * fVar205;
        auVar196._8_4_ = auVar37._8_4_ * fVar207;
        auVar196._12_4_ = auVar37._12_4_ * fVar209;
        auVar214._0_4_ = auVar36._0_4_ * fVar194;
        auVar214._4_4_ = auVar36._4_4_ * fVar205;
        auVar214._8_4_ = auVar36._8_4_ * fVar207;
        auVar214._12_4_ = auVar36._12_4_ * fVar209;
        auVar178._0_4_ = auVar46._0_4_ * fVar194;
        auVar178._4_4_ = auVar46._4_4_ * fVar205;
        auVar178._8_4_ = auVar46._8_4_ * fVar207;
        auVar178._12_4_ = auVar46._12_4_ * fVar209;
        auVar47 = vfmadd231ps_fma(auVar190,auVar228,auVar60);
        auVar37 = vfmadd231ps_fma(auVar196,auVar228,auVar161);
        auVar52 = vfmadd231ps_fma(auVar214,auVar228,auVar54);
        auVar53 = vfmadd231ps_fma(auVar178,(undefined1  [16])0x0,auVar228);
        auVar50 = vshufpd_avx(auVar47,auVar47,1);
        auVar51 = vshufpd_avx(auVar37,auVar37,1);
        auVar48 = vshufpd_avx512vl(auVar52,auVar52,1);
        auVar49 = vshufpd_avx512vl(auVar53,auVar53,1);
        auVar36 = vminss_avx(auVar47,auVar37);
        auVar47 = vmaxss_avx(auVar37,auVar47);
        auVar46 = vminss_avx(auVar52,auVar53);
        auVar37 = vmaxss_avx(auVar53,auVar52);
        auVar36 = vminss_avx(auVar36,auVar46);
        auVar47 = vmaxss_avx(auVar37,auVar47);
        auVar46 = vminss_avx(auVar50,auVar51);
        auVar37 = vmaxss_avx(auVar51,auVar50);
        auVar50 = vminss_avx512f(auVar48,auVar49);
        auVar51 = vmaxss_avx512f(auVar49,auVar48);
        auVar37 = vmaxss_avx(auVar51,auVar37);
        auVar83._0_16_ = vminss_avx512f(auVar46,auVar50);
        vucomiss_avx512f(auVar36);
        fVar205 = auVar37._0_4_;
        fVar194 = auVar47._0_4_;
        if (4 < (uint)uVar19) {
          bVar31 = fVar205 == -0.0001;
          bVar28 = NAN(fVar205);
          if (fVar205 <= -0.0001) goto LAB_01ab52d7;
          break;
        }
LAB_01ab52d7:
        auVar46 = vucomiss_avx512f(auVar83._0_16_);
        bVar31 = fVar205 <= -0.0001;
        bVar29 = -0.0001 < fVar194;
        bVar28 = bVar31;
        if (!bVar31) break;
        uVar21 = vcmpps_avx512vl(auVar36,auVar46,5);
        uVar22 = vcmpps_avx512vl(auVar83._0_16_,auVar46,5);
        bVar17 = (uVar21 & uVar22 & 1) == 0;
        bVar31 = bVar29 && bVar17;
        bVar28 = bVar29 && (uVar21 & uVar22 & 1) == 0;
      } while (!bVar29 || !bVar17);
      auVar51 = auVar242._0_16_;
      vcmpss_avx512f(auVar36,auVar51,1);
      uVar11 = vcmpss_avx512f(auVar47,auVar51,1);
      bVar29 = (bool)((byte)uVar11 & 1);
      auVar85._16_48_ = auVar83._16_48_;
      auVar85._0_16_ = auVar243._0_16_;
      auVar84._4_60_ = auVar85._4_60_;
      auVar84._0_4_ = (float)((uint)bVar29 * -0x40800000 + (uint)!bVar29 * auVar243._0_4_);
      vucomiss_avx512f(auVar84._0_16_);
      bVar28 = (bool)(!bVar31 | bVar28);
      bVar29 = bVar28 == false;
      auVar87._16_48_ = auVar83._16_48_;
      auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar86._4_60_ = auVar87._4_60_;
      auVar86._0_4_ = (uint)bVar28 * auVar242._0_4_ + (uint)!bVar28 * 0x7f800000;
      auVar50 = auVar86._0_16_;
      auVar89._16_48_ = auVar83._16_48_;
      auVar89._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar88._4_60_ = auVar89._4_60_;
      auVar88._0_4_ = (uint)bVar28 * auVar242._0_4_ + (uint)!bVar28 * -0x800000;
      auVar46 = auVar88._0_16_;
      uVar11 = vcmpss_avx512f(auVar83._0_16_,auVar51,1);
      bVar31 = (bool)((byte)uVar11 & 1);
      auVar91._16_48_ = auVar83._16_48_;
      auVar91._0_16_ = auVar243._0_16_;
      auVar90._4_60_ = auVar91._4_60_;
      auVar90._0_4_ = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * auVar243._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      if ((bVar28) || (bVar29)) {
        auVar52 = vucomiss_avx512f(auVar36);
        if ((bVar28) || (bVar29)) {
          auVar53 = vxorps_avx512vl(auVar36,auVar236._0_16_);
          auVar36 = vsubss_avx512f(auVar52,auVar36);
          auVar36 = vdivss_avx512f(auVar53,auVar36);
          auVar52 = vsubss_avx512f(ZEXT416(0x3f800000),auVar36);
          auVar52 = vfmadd213ss_avx512f(auVar52,auVar51,auVar36);
          auVar36 = auVar52;
        }
        else {
          auVar36 = vxorps_avx512vl(auVar52,auVar52);
          vucomiss_avx512f(auVar36);
          auVar52 = ZEXT416(0x3f800000);
          if ((bVar28) || (bVar29)) {
            auVar52 = SUB6416(ZEXT464(0xff800000),0);
            auVar36 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar50 = vminss_avx512f(auVar50,auVar36);
        auVar46 = vmaxss_avx(auVar52,auVar46);
      }
      auVar243 = ZEXT464(0x3f800000);
      uVar11 = vcmpss_avx512f(auVar37,auVar51,1);
      bVar31 = (bool)((byte)uVar11 & 1);
      auVar37 = auVar243._0_16_;
      fVar207 = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * 0x3f800000);
      if ((auVar84._0_4_ != fVar207) || (NAN(auVar84._0_4_) || NAN(fVar207))) {
        if ((fVar205 != fVar194) || (NAN(fVar205) || NAN(fVar194))) {
          auVar47 = vxorps_avx512vl(auVar47,auVar236._0_16_);
          auVar179._0_4_ = auVar47._0_4_ / (fVar205 - fVar194);
          auVar179._4_12_ = auVar47._4_12_;
          auVar47 = vsubss_avx512f(auVar37,auVar179);
          auVar47 = vfmadd213ss_avx512f(auVar47,auVar51,auVar179);
          auVar36 = auVar47;
        }
        else if ((fVar194 != 0.0) ||
                (auVar47 = auVar37, auVar36 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar194))) {
          auVar47 = SUB6416(ZEXT464(0xff800000),0);
          auVar36 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar50 = vminss_avx(auVar50,auVar36);
        auVar46 = vmaxss_avx(auVar47,auVar46);
      }
      bVar31 = auVar90._0_4_ != fVar207;
      auVar47 = vminss_avx512f(auVar50,auVar37);
      auVar93._16_48_ = auVar83._16_48_;
      auVar93._0_16_ = auVar50;
      auVar92._4_60_ = auVar93._4_60_;
      auVar92._0_4_ = (uint)bVar31 * auVar47._0_4_ + (uint)!bVar31 * auVar50._0_4_;
      auVar47 = vmaxss_avx512f(auVar37,auVar46);
      auVar95._16_48_ = auVar83._16_48_;
      auVar95._0_16_ = auVar46;
      auVar94._4_60_ = auVar95._4_60_;
      auVar94._0_4_ = (uint)bVar31 * auVar47._0_4_ + (uint)!bVar31 * auVar46._0_4_;
      auVar47 = vmaxss_avx512f(auVar51,auVar92._0_16_);
      auVar83._0_16_ = vminss_avx512f(auVar94._0_16_,auVar37);
    } while (auVar83._0_4_ < auVar47._0_4_);
    auVar52 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
    auVar53 = vminss_avx512f(ZEXT416((uint)(auVar83._0_4_ + 0.1)),auVar37);
    auVar129._0_8_ = auVar60._0_8_;
    auVar129._8_8_ = auVar129._0_8_;
    auVar197._8_8_ = auVar161._0_8_;
    auVar197._0_8_ = auVar161._0_8_;
    auVar215._8_8_ = auVar54._0_8_;
    auVar215._0_8_ = auVar54._0_8_;
    auVar47 = vshufpd_avx(auVar161,auVar161,3);
    auVar36 = vshufpd_avx(auVar54,auVar54,3);
    auVar46 = vshufps_avx(auVar52,auVar53,0);
    auVar54 = vsubps_avx512vl(auVar38,auVar46);
    fVar194 = auVar46._0_4_;
    auVar155._0_4_ = fVar194 * auVar55._0_4_;
    fVar205 = auVar46._4_4_;
    auVar155._4_4_ = fVar205 * auVar55._4_4_;
    fVar207 = auVar46._8_4_;
    auVar155._8_4_ = fVar207 * auVar55._8_4_;
    fVar209 = auVar46._12_4_;
    auVar155._12_4_ = fVar209 * auVar55._12_4_;
    auVar162._0_4_ = fVar194 * auVar47._0_4_;
    auVar162._4_4_ = fVar205 * auVar47._4_4_;
    auVar162._8_4_ = fVar207 * auVar47._8_4_;
    auVar162._12_4_ = fVar209 * auVar47._12_4_;
    auVar231._0_4_ = auVar36._0_4_ * fVar194;
    auVar231._4_4_ = auVar36._4_4_ * fVar205;
    auVar231._8_4_ = auVar36._8_4_ * fVar207;
    auVar231._12_4_ = auVar36._12_4_ * fVar209;
    auVar149._0_4_ = fVar194 * auVar57._0_4_;
    auVar149._4_4_ = fVar205 * auVar57._4_4_;
    auVar149._8_4_ = fVar207 * auVar57._8_4_;
    auVar149._12_4_ = fVar209 * auVar57._12_4_;
    auVar57 = vfmadd231ps_fma(auVar155,auVar54,auVar129);
    auVar50 = vfmadd231ps_fma(auVar162,auVar54,auVar197);
    auVar51 = vfmadd231ps_fma(auVar231,auVar54,auVar215);
    auVar54 = vfmadd231ps_fma(auVar149,auVar54,ZEXT816(0));
    auVar36 = vsubss_avx512f(auVar37,auVar52);
    auVar47 = vmovshdup_avx(auVar110);
    auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar52._0_4_)),auVar110,auVar36);
    auVar36 = vsubss_avx512f(auVar37,auVar53);
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar53._0_4_)),auVar110,auVar36);
    auVar52 = vdivss_avx512f(auVar37,ZEXT416((uint)fVar210));
    auVar47 = vsubps_avx(auVar50,auVar57);
    auVar230 = auVar107._0_16_;
    auVar46 = vmulps_avx512vl(auVar47,auVar230);
    auVar47 = vsubps_avx(auVar51,auVar50);
    auVar55 = vmulps_avx512vl(auVar47,auVar230);
    auVar47 = vsubps_avx(auVar54,auVar51);
    auVar47 = vmulps_avx512vl(auVar47,auVar230);
    auVar36 = vminps_avx(auVar55,auVar47);
    auVar47 = vmaxps_avx(auVar55,auVar47);
    auVar36 = vminps_avx(auVar46,auVar36);
    auVar47 = vmaxps_avx(auVar46,auVar47);
    auVar46 = vshufpd_avx(auVar36,auVar36,3);
    auVar55 = vshufpd_avx(auVar47,auVar47,3);
    auVar36 = vminps_avx(auVar36,auVar46);
    auVar47 = vmaxps_avx(auVar47,auVar55);
    fVar210 = auVar52._0_4_;
    auVar180._0_4_ = auVar36._0_4_ * fVar210;
    auVar180._4_4_ = auVar36._4_4_ * fVar210;
    auVar180._8_4_ = auVar36._8_4_ * fVar210;
    auVar180._12_4_ = auVar36._12_4_ * fVar210;
    auVar171._0_4_ = fVar210 * auVar47._0_4_;
    auVar171._4_4_ = fVar210 * auVar47._4_4_;
    auVar171._8_4_ = fVar210 * auVar47._8_4_;
    auVar171._12_4_ = fVar210 * auVar47._12_4_;
    auVar52 = vdivss_avx512f(auVar37,ZEXT416((uint)(auVar49._0_4_ - auVar48._0_4_)));
    auVar47 = vshufpd_avx(auVar57,auVar57,3);
    auVar36 = vshufpd_avx(auVar50,auVar50,3);
    auVar46 = vshufpd_avx(auVar51,auVar51,3);
    auVar55 = vshufpd_avx(auVar54,auVar54,3);
    auVar47 = vsubps_avx(auVar47,auVar57);
    auVar57 = vsubps_avx(auVar36,auVar50);
    auVar50 = vsubps_avx(auVar46,auVar51);
    auVar55 = vsubps_avx(auVar55,auVar54);
    auVar36 = vminps_avx(auVar47,auVar57);
    auVar47 = vmaxps_avx(auVar47,auVar57);
    auVar46 = vminps_avx(auVar50,auVar55);
    auVar46 = vminps_avx(auVar36,auVar46);
    auVar36 = vmaxps_avx(auVar50,auVar55);
    auVar47 = vmaxps_avx(auVar47,auVar36);
    fVar210 = auVar52._0_4_;
    auVar216._0_4_ = fVar210 * auVar46._0_4_;
    auVar216._4_4_ = fVar210 * auVar46._4_4_;
    auVar216._8_4_ = fVar210 * auVar46._8_4_;
    auVar216._12_4_ = fVar210 * auVar46._12_4_;
    auVar198._0_4_ = fVar210 * auVar47._0_4_;
    auVar198._4_4_ = fVar210 * auVar47._4_4_;
    auVar198._8_4_ = fVar210 * auVar47._8_4_;
    auVar198._12_4_ = fVar210 * auVar47._12_4_;
    auVar55 = vinsertps_avx(auVar33,auVar48,0x10);
    auVar56 = vpermt2ps_avx512vl(auVar33,_DAT_01feecd0,auVar49);
    auVar111._0_4_ = auVar55._0_4_ + auVar56._0_4_;
    auVar111._4_4_ = auVar55._4_4_ + auVar56._4_4_;
    auVar111._8_4_ = auVar55._8_4_ + auVar56._8_4_;
    auVar111._12_4_ = auVar55._12_4_ + auVar56._12_4_;
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
    auVar52 = vmulps_avx512vl(auVar111,auVar15);
    auVar36 = vshufps_avx(auVar52,auVar52,0x54);
    uVar98 = auVar52._0_4_;
    auVar123._4_4_ = uVar98;
    auVar123._0_4_ = uVar98;
    auVar123._8_4_ = uVar98;
    auVar123._12_4_ = uVar98;
    auVar46 = vfmadd213ps_fma(local_450,auVar123,auVar35);
    auVar57 = vfmadd213ps_fma(local_460,auVar123,auVar44);
    auVar50 = vfmadd213ps_fma(local_470,auVar123,auVar41);
    auVar47 = vsubps_avx(auVar57,auVar46);
    auVar46 = vfmadd213ps_fma(auVar47,auVar123,auVar46);
    auVar47 = vsubps_avx(auVar50,auVar57);
    auVar47 = vfmadd213ps_fma(auVar47,auVar123,auVar57);
    auVar47 = vsubps_avx(auVar47,auVar46);
    auVar46 = vfmadd231ps_fma(auVar46,auVar47,auVar123);
    auVar51 = vmulps_avx512vl(auVar47,auVar230);
    auVar224._8_8_ = auVar46._0_8_;
    auVar224._0_8_ = auVar46._0_8_;
    auVar47 = vshufpd_avx(auVar46,auVar46,3);
    auVar46 = vshufps_avx(auVar52,auVar52,0x55);
    auVar57 = vsubps_avx(auVar47,auVar224);
    auVar50 = vfmadd231ps_fma(auVar224,auVar46,auVar57);
    auVar232._8_8_ = auVar51._0_8_;
    auVar232._0_8_ = auVar51._0_8_;
    auVar47 = vshufpd_avx(auVar51,auVar51,3);
    auVar47 = vsubps_avx512vl(auVar47,auVar232);
    auVar47 = vfmadd213ps_avx512vl(auVar47,auVar46,auVar232);
    auVar124._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
    auVar124._8_4_ = auVar57._8_4_ ^ 0x80000000;
    auVar124._12_4_ = auVar57._12_4_ ^ 0x80000000;
    auVar46 = vmovshdup_avx512vl(auVar47);
    auVar233._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
    auVar233._8_4_ = auVar46._8_4_ ^ 0x80000000;
    auVar233._12_4_ = auVar46._12_4_ ^ 0x80000000;
    auVar51 = vmovshdup_avx512vl(auVar57);
    auVar54 = vpermt2ps_avx512vl(auVar233,ZEXT416(5),auVar57);
    auVar46 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar46._0_4_ * auVar57._0_4_)),auVar47,auVar51);
    auVar57 = vpermt2ps_avx512vl(auVar47,SUB6416(ZEXT464(4),0),auVar124);
    auVar150._0_4_ = auVar46._0_4_;
    auVar150._4_4_ = auVar150._0_4_;
    auVar150._8_4_ = auVar150._0_4_;
    auVar150._12_4_ = auVar150._0_4_;
    auVar47 = vdivps_avx(auVar54,auVar150);
    auVar58 = vdivps_avx512vl(auVar57,auVar150);
    fVar210 = auVar50._0_4_;
    auVar46 = vshufps_avx(auVar50,auVar50,0x55);
    auVar225._0_4_ = fVar210 * auVar47._0_4_ + auVar46._0_4_ * auVar58._0_4_;
    auVar225._4_4_ = fVar210 * auVar47._4_4_ + auVar46._4_4_ * auVar58._4_4_;
    auVar225._8_4_ = fVar210 * auVar47._8_4_ + auVar46._8_4_ * auVar58._8_4_;
    auVar225._12_4_ = fVar210 * auVar47._12_4_ + auVar46._12_4_ * auVar58._12_4_;
    auVar53 = vsubps_avx(auVar36,auVar225);
    auVar46 = vmovshdup_avx(auVar47);
    auVar36 = vinsertps_avx(auVar180,auVar216,0x1c);
    auVar234._0_4_ = auVar46._0_4_ * auVar36._0_4_;
    auVar234._4_4_ = auVar46._4_4_ * auVar36._4_4_;
    auVar234._8_4_ = auVar46._8_4_ * auVar36._8_4_;
    auVar234._12_4_ = auVar46._12_4_ * auVar36._12_4_;
    auVar60 = vinsertps_avx512f(auVar171,auVar198,0x1c);
    auVar46 = vmulps_avx512vl(auVar46,auVar60);
    auVar54 = vminps_avx512vl(auVar234,auVar46);
    auVar50 = vmaxps_avx(auVar46,auVar234);
    auVar51 = vmovshdup_avx(auVar58);
    auVar46 = vinsertps_avx(auVar216,auVar180,0x4c);
    auVar217._0_4_ = auVar51._0_4_ * auVar46._0_4_;
    auVar217._4_4_ = auVar51._4_4_ * auVar46._4_4_;
    auVar217._8_4_ = auVar51._8_4_ * auVar46._8_4_;
    auVar217._12_4_ = auVar51._12_4_ * auVar46._12_4_;
    auVar57 = vinsertps_avx(auVar198,auVar171,0x4c);
    auVar199._0_4_ = auVar51._0_4_ * auVar57._0_4_;
    auVar199._4_4_ = auVar51._4_4_ * auVar57._4_4_;
    auVar199._8_4_ = auVar51._8_4_ * auVar57._8_4_;
    auVar199._12_4_ = auVar51._12_4_ * auVar57._12_4_;
    auVar51 = vminps_avx(auVar217,auVar199);
    auVar54 = vaddps_avx512vl(auVar54,auVar51);
    auVar51 = vmaxps_avx(auVar199,auVar217);
    auVar200._0_4_ = auVar50._0_4_ + auVar51._0_4_;
    auVar200._4_4_ = auVar50._4_4_ + auVar51._4_4_;
    auVar200._8_4_ = auVar50._8_4_ + auVar51._8_4_;
    auVar200._12_4_ = auVar50._12_4_ + auVar51._12_4_;
    auVar218._8_8_ = 0x3f80000000000000;
    auVar218._0_8_ = 0x3f80000000000000;
    auVar50 = vsubps_avx(auVar218,auVar200);
    auVar51 = vsubps_avx(auVar218,auVar54);
    auVar54 = vsubps_avx(auVar55,auVar52);
    auVar52 = vsubps_avx(auVar56,auVar52);
    fVar209 = auVar54._0_4_;
    auVar235._0_4_ = fVar209 * auVar50._0_4_;
    fVar193 = auVar54._4_4_;
    auVar235._4_4_ = fVar193 * auVar50._4_4_;
    fVar204 = auVar54._8_4_;
    auVar235._8_4_ = fVar204 * auVar50._8_4_;
    fVar211 = auVar54._12_4_;
    auVar235._12_4_ = fVar211 * auVar50._12_4_;
    auVar59 = vbroadcastss_avx512vl(auVar47);
    auVar36 = vmulps_avx512vl(auVar59,auVar36);
    auVar60 = vmulps_avx512vl(auVar59,auVar60);
    auVar59 = vminps_avx512vl(auVar36,auVar60);
    auVar60 = vmaxps_avx512vl(auVar60,auVar36);
    auVar36 = vbroadcastss_avx512vl(auVar58);
    auVar46 = vmulps_avx512vl(auVar36,auVar46);
    auVar36 = vmulps_avx512vl(auVar36,auVar57);
    auVar57 = vminps_avx512vl(auVar46,auVar36);
    auVar57 = vaddps_avx512vl(auVar59,auVar57);
    auVar54 = vmulps_avx512vl(auVar54,auVar51);
    fVar210 = auVar52._0_4_;
    auVar201._0_4_ = fVar210 * auVar50._0_4_;
    fVar194 = auVar52._4_4_;
    auVar201._4_4_ = fVar194 * auVar50._4_4_;
    fVar205 = auVar52._8_4_;
    auVar201._8_4_ = fVar205 * auVar50._8_4_;
    fVar207 = auVar52._12_4_;
    auVar201._12_4_ = fVar207 * auVar50._12_4_;
    auVar219._0_4_ = fVar210 * auVar51._0_4_;
    auVar219._4_4_ = fVar194 * auVar51._4_4_;
    auVar219._8_4_ = fVar205 * auVar51._8_4_;
    auVar219._12_4_ = fVar207 * auVar51._12_4_;
    auVar36 = vmaxps_avx(auVar36,auVar46);
    auVar172._0_4_ = auVar60._0_4_ + auVar36._0_4_;
    auVar172._4_4_ = auVar60._4_4_ + auVar36._4_4_;
    auVar172._8_4_ = auVar60._8_4_ + auVar36._8_4_;
    auVar172._12_4_ = auVar60._12_4_ + auVar36._12_4_;
    auVar181._8_8_ = 0x3f800000;
    auVar181._0_8_ = 0x3f800000;
    auVar36 = vsubps_avx(auVar181,auVar172);
    auVar46 = vsubps_avx512vl(auVar181,auVar57);
    auVar229._0_4_ = fVar209 * auVar36._0_4_;
    auVar229._4_4_ = fVar193 * auVar36._4_4_;
    auVar229._8_4_ = fVar204 * auVar36._8_4_;
    auVar229._12_4_ = fVar211 * auVar36._12_4_;
    auVar226._0_4_ = fVar209 * auVar46._0_4_;
    auVar226._4_4_ = fVar193 * auVar46._4_4_;
    auVar226._8_4_ = fVar204 * auVar46._8_4_;
    auVar226._12_4_ = fVar211 * auVar46._12_4_;
    auVar173._0_4_ = fVar210 * auVar36._0_4_;
    auVar173._4_4_ = fVar194 * auVar36._4_4_;
    auVar173._8_4_ = fVar205 * auVar36._8_4_;
    auVar173._12_4_ = fVar207 * auVar36._12_4_;
    auVar182._0_4_ = fVar210 * auVar46._0_4_;
    auVar182._4_4_ = fVar194 * auVar46._4_4_;
    auVar182._8_4_ = fVar205 * auVar46._8_4_;
    auVar182._12_4_ = fVar207 * auVar46._12_4_;
    auVar36 = vminps_avx(auVar229,auVar226);
    auVar46 = vminps_avx512vl(auVar173,auVar182);
    auVar57 = vminps_avx512vl(auVar36,auVar46);
    auVar36 = vmaxps_avx(auVar226,auVar229);
    auVar46 = vmaxps_avx(auVar182,auVar173);
    auVar46 = vmaxps_avx(auVar46,auVar36);
    auVar50 = vminps_avx512vl(auVar235,auVar54);
    auVar36 = vminps_avx(auVar201,auVar219);
    auVar36 = vminps_avx(auVar50,auVar36);
    auVar36 = vhaddps_avx(auVar57,auVar36);
    auVar50 = vmaxps_avx512vl(auVar54,auVar235);
    auVar57 = vmaxps_avx(auVar219,auVar201);
    auVar57 = vmaxps_avx(auVar57,auVar50);
    auVar46 = vhaddps_avx(auVar46,auVar57);
    auVar36 = vshufps_avx(auVar36,auVar36,0xe8);
    auVar46 = vshufps_avx(auVar46,auVar46,0xe8);
    auVar174._0_4_ = auVar36._0_4_ + auVar53._0_4_;
    auVar174._4_4_ = auVar36._4_4_ + auVar53._4_4_;
    auVar174._8_4_ = auVar36._8_4_ + auVar53._8_4_;
    auVar174._12_4_ = auVar36._12_4_ + auVar53._12_4_;
    auVar183._0_4_ = auVar46._0_4_ + auVar53._0_4_;
    auVar183._4_4_ = auVar46._4_4_ + auVar53._4_4_;
    auVar183._8_4_ = auVar46._8_4_ + auVar53._8_4_;
    auVar183._12_4_ = auVar46._12_4_ + auVar53._12_4_;
    auVar36 = vmaxps_avx(auVar55,auVar174);
    auVar46 = vminps_avx(auVar183,auVar56);
    uVar21 = vcmpps_avx512vl(auVar46,auVar36,1);
    auVar36 = ZEXT416(5);
    if ((uVar21 & 3) != 0) {
      auVar83._0_16_ = vxorps_avx512vl(ZEXT416(5),auVar36);
      auVar242 = ZEXT1664(auVar83._0_16_);
      goto LAB_01ab50ae;
    }
    uVar21 = vcmpps_avx512vl(auVar183,auVar56,1);
    uVar11 = vcmpps_avx512vl(auVar33,auVar174,1);
    if (((ushort)uVar11 & (ushort)uVar21 & 1) == 0) {
      bVar24 = 0;
    }
    else {
      auVar46 = vmovshdup_avx(auVar174);
      bVar24 = auVar48._0_4_ < auVar46._0_4_ & (byte)(uVar21 >> 1) & 0x7f;
    }
    auVar96._0_16_ = vxorps_avx512vl(auVar36,auVar36);
    auVar96._16_48_ = auVar83._16_48_;
    auVar242 = ZEXT1664(auVar96._0_16_);
    local_610 = auVar10._0_4_;
    fStack_60c = auVar10._4_4_;
    fStack_608 = auVar10._8_4_;
    fStack_604 = auVar10._12_4_;
    if (((3 < (uint)uVar19 || uVar5 != 0 && !bVar30) | bVar24) == 1) {
      lVar23 = 200;
      auVar83 = auVar96;
      do {
        auVar33 = vsubss_avx512f(auVar37,auVar53);
        fVar205 = auVar33._0_4_;
        fVar210 = fVar205 * fVar205 * fVar205;
        fVar207 = auVar53._0_4_;
        fVar194 = fVar207 * 3.0 * fVar205 * fVar205;
        fVar205 = fVar205 * fVar207 * fVar207 * 3.0;
        auVar138._4_4_ = fVar210;
        auVar138._0_4_ = fVar210;
        auVar138._8_4_ = fVar210;
        auVar138._12_4_ = fVar210;
        auVar130._4_4_ = fVar194;
        auVar130._0_4_ = fVar194;
        auVar130._8_4_ = fVar194;
        auVar130._12_4_ = fVar194;
        auVar104._4_4_ = fVar205;
        auVar104._0_4_ = fVar205;
        auVar104._8_4_ = fVar205;
        auVar104._12_4_ = fVar205;
        fVar207 = fVar207 * fVar207 * fVar207;
        auVar156._0_4_ = local_610 * fVar207;
        auVar156._4_4_ = fStack_60c * fVar207;
        auVar156._8_4_ = fStack_608 * fVar207;
        auVar156._12_4_ = fStack_604 * fVar207;
        auVar33 = vfmadd231ps_fma(auVar156,auVar41,auVar104);
        auVar33 = vfmadd231ps_fma(auVar33,auVar44,auVar130);
        auVar33 = vfmadd231ps_fma(auVar33,auVar35,auVar138);
        auVar105._8_8_ = auVar33._0_8_;
        auVar105._0_8_ = auVar33._0_8_;
        auVar33 = vshufpd_avx(auVar33,auVar33,3);
        auVar36 = vshufps_avx(auVar53,auVar53,0x55);
        auVar33 = vsubps_avx(auVar33,auVar105);
        auVar36 = vfmadd213ps_fma(auVar33,auVar36,auVar105);
        fVar210 = auVar36._0_4_;
        auVar33 = vshufps_avx(auVar36,auVar36,0x55);
        auVar106._0_4_ = auVar47._0_4_ * fVar210 + auVar58._0_4_ * auVar33._0_4_;
        auVar106._4_4_ = auVar47._4_4_ * fVar210 + auVar58._4_4_ * auVar33._4_4_;
        auVar106._8_4_ = auVar47._8_4_ * fVar210 + auVar58._8_4_ * auVar33._8_4_;
        auVar106._12_4_ = auVar47._12_4_ * fVar210 + auVar58._12_4_ * auVar33._12_4_;
        auVar53 = vsubps_avx(auVar53,auVar106);
        auVar33 = vandps_avx512vl(auVar36,auVar240._0_16_);
        auVar83._0_16_ = vprolq_avx512vl(auVar33,0x20);
        auVar33 = vmaxss_avx(auVar83._0_16_,auVar33);
        bVar30 = auVar33._0_4_ <= fVar97;
        if (auVar33._0_4_ < fVar97) {
          auVar33 = vucomiss_avx512f(auVar96._0_16_);
          if (bVar30) {
            auVar47 = vucomiss_avx512f(auVar33);
            auVar243 = ZEXT1664(auVar47);
            if (bVar30) {
              vmovshdup_avx(auVar33);
              auVar47 = vucomiss_avx512f(auVar96._0_16_);
              if (bVar30) {
                auVar37 = vucomiss_avx512f(auVar47);
                auVar243 = ZEXT1664(auVar37);
                if (bVar30) {
                  auVar36 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar52 = vinsertps_avx(auVar36,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar36 = vdpps_avx(auVar52,local_480,0x7f);
                  auVar46 = vdpps_avx(auVar52,local_490,0x7f);
                  auVar55 = vdpps_avx(auVar52,local_4a0,0x7f);
                  auVar57 = vdpps_avx(auVar52,local_4b0,0x7f);
                  auVar50 = vdpps_avx(auVar52,local_4c0,0x7f);
                  auVar51 = vdpps_avx(auVar52,local_4d0,0x7f);
                  auVar54 = vdpps_avx(auVar52,local_4e0,0x7f);
                  auVar52 = vdpps_avx(auVar52,local_4f0,0x7f);
                  auVar53 = vsubss_avx512f(auVar37,auVar47);
                  fVar210 = auVar47._0_4_;
                  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar50._0_4_)),auVar53,auVar36
                                           );
                  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * fVar210)),auVar53,auVar46
                                           );
                  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar210)),auVar53,auVar55
                                           );
                  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar52._0_4_)),auVar53,auVar57
                                           );
                  auVar83._0_16_ = vsubss_avx512f(auVar37,auVar33);
                  auVar157._0_4_ = auVar83._0_4_;
                  fVar210 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
                  fVar207 = auVar33._0_4_;
                  fVar194 = fVar207 * 3.0 * auVar157._0_4_ * auVar157._0_4_;
                  fVar205 = auVar157._0_4_ * fVar207 * fVar207 * 3.0;
                  fVar209 = fVar207 * fVar207 * fVar207;
                  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar55._0_4_)),
                                            ZEXT416((uint)fVar205),auVar46);
                  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar194),auVar36);
                  vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar210),auVar47);
                  auVar47 = vucomiss_avx512f(ZEXT416(uVar27));
                  if (bVar30) {
                    fVar193 = *(float *)(ray + k * 4 + 0x200);
                    if (auVar47._0_4_ <= fVar193) {
                      auVar37 = vshufps_avx(auVar33,auVar33,0x55);
                      auVar46 = vsubps_avx512vl(auVar38,auVar37);
                      fVar204 = auVar37._0_4_;
                      auVar184._0_4_ = fVar204 * (float)local_510._0_4_;
                      fVar211 = auVar37._4_4_;
                      auVar184._4_4_ = fVar211 * (float)local_510._4_4_;
                      fVar220 = auVar37._8_4_;
                      auVar184._8_4_ = fVar220 * fStack_508;
                      fVar221 = auVar37._12_4_;
                      auVar184._12_4_ = fVar221 * fStack_504;
                      auVar191._0_4_ = fVar204 * (float)local_560._0_4_;
                      auVar191._4_4_ = fVar211 * (float)local_560._4_4_;
                      auVar191._8_4_ = fVar220 * fStack_558;
                      auVar191._12_4_ = fVar221 * fStack_554;
                      auVar202._0_4_ = fVar204 * (float)local_570._0_4_;
                      auVar202._4_4_ = fVar211 * (float)local_570._4_4_;
                      auVar202._8_4_ = fVar220 * fStack_568;
                      auVar202._12_4_ = fVar221 * fStack_564;
                      auVar163._0_4_ = fVar204 * (float)local_530._0_4_;
                      auVar163._4_4_ = fVar211 * (float)local_530._4_4_;
                      auVar163._8_4_ = fVar220 * fStack_528;
                      auVar163._12_4_ = fVar221 * fStack_524;
                      auVar38 = vfmadd231ps_fma(auVar184,auVar46,local_500);
                      auVar37 = vfmadd231ps_fma(auVar191,auVar46,local_540);
                      auVar36 = vfmadd231ps_fma(auVar202,auVar46,local_550);
                      auVar46 = vfmadd231ps_fma(auVar163,auVar46,local_520);
                      auVar38 = vsubps_avx(auVar37,auVar38);
                      auVar37 = vsubps_avx(auVar36,auVar37);
                      auVar36 = vsubps_avx(auVar46,auVar36);
                      auVar203._0_4_ = fVar207 * auVar37._0_4_;
                      auVar203._4_4_ = fVar207 * auVar37._4_4_;
                      auVar203._8_4_ = fVar207 * auVar37._8_4_;
                      auVar203._12_4_ = fVar207 * auVar37._12_4_;
                      auVar157._4_4_ = auVar157._0_4_;
                      auVar157._8_4_ = auVar157._0_4_;
                      auVar157._12_4_ = auVar157._0_4_;
                      auVar38 = vfmadd231ps_fma(auVar203,auVar157,auVar38);
                      auVar164._0_4_ = fVar207 * auVar36._0_4_;
                      auVar164._4_4_ = fVar207 * auVar36._4_4_;
                      auVar164._8_4_ = fVar207 * auVar36._8_4_;
                      auVar164._12_4_ = fVar207 * auVar36._12_4_;
                      auVar37 = vfmadd231ps_fma(auVar164,auVar157,auVar37);
                      auVar165._0_4_ = fVar207 * auVar37._0_4_;
                      auVar165._4_4_ = fVar207 * auVar37._4_4_;
                      auVar165._8_4_ = fVar207 * auVar37._8_4_;
                      auVar165._12_4_ = fVar207 * auVar37._12_4_;
                      auVar38 = vfmadd231ps_fma(auVar165,auVar157,auVar38);
                      auVar83._0_16_ = vmulps_avx512vl(auVar38,auVar230);
                      pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                      if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
LAB_01ab6019:
                        bVar24 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar24 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar151._0_4_ = fVar209 * (float)local_5c0._0_4_;
                        auVar151._4_4_ = fVar209 * (float)local_5c0._4_4_;
                        auVar151._8_4_ = fVar209 * fStack_5b8;
                        auVar151._12_4_ = fVar209 * fStack_5b4;
                        auVar139._4_4_ = fVar205;
                        auVar139._0_4_ = fVar205;
                        auVar139._8_4_ = fVar205;
                        auVar139._12_4_ = fVar205;
                        auVar38 = vfmadd132ps_fma(auVar139,auVar151,local_5b0);
                        auVar131._4_4_ = fVar194;
                        auVar131._0_4_ = fVar194;
                        auVar131._8_4_ = fVar194;
                        auVar131._12_4_ = fVar194;
                        auVar38 = vfmadd132ps_fma(auVar131,auVar38,local_5a0);
                        auVar125._4_4_ = fVar210;
                        auVar125._0_4_ = fVar210;
                        auVar125._8_4_ = fVar210;
                        auVar125._12_4_ = fVar210;
                        auVar36 = vfmadd132ps_fma(auVar125,auVar38,local_590);
                        auVar38 = vshufps_avx(auVar36,auVar36,0xc9);
                        auVar37 = vshufps_avx(auVar83._0_16_,auVar83._0_16_,0xc9);
                        auVar126._0_4_ = auVar36._0_4_ * auVar37._0_4_;
                        auVar126._4_4_ = auVar36._4_4_ * auVar37._4_4_;
                        auVar126._8_4_ = auVar36._8_4_ * auVar37._8_4_;
                        auVar126._12_4_ = auVar36._12_4_ * auVar37._12_4_;
                        auVar38 = vfmsub231ps_fma(auVar126,auVar83._0_16_,auVar38);
                        local_200 = vbroadcastss_avx512f(auVar33);
                        auVar240 = vbroadcastss_avx512f(ZEXT416(1));
                        local_1c0 = vpermps_avx512f(auVar240,ZEXT1664(auVar33));
                        auVar240 = vpermps_avx512f(auVar240,ZEXT1664(auVar38));
                        auVar242 = vbroadcastss_avx512f(ZEXT416(2));
                        local_280 = vpermps_avx512f(auVar242,ZEXT1664(auVar38));
                        local_240 = vbroadcastss_avx512f(auVar38);
                        local_2c0[0] = (RTCHitN)auVar240[0];
                        local_2c0[1] = (RTCHitN)auVar240[1];
                        local_2c0[2] = (RTCHitN)auVar240[2];
                        local_2c0[3] = (RTCHitN)auVar240[3];
                        local_2c0[4] = (RTCHitN)auVar240[4];
                        local_2c0[5] = (RTCHitN)auVar240[5];
                        local_2c0[6] = (RTCHitN)auVar240[6];
                        local_2c0[7] = (RTCHitN)auVar240[7];
                        local_2c0[8] = (RTCHitN)auVar240[8];
                        local_2c0[9] = (RTCHitN)auVar240[9];
                        local_2c0[10] = (RTCHitN)auVar240[10];
                        local_2c0[0xb] = (RTCHitN)auVar240[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar240[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar240[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar240[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar240[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar240[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar240[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar240[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar240[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar240[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar240[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar240[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar240[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar240[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar240[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar240[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar240[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar240[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar240[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar240[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar240[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar240[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar240[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar240[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar240[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar240[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar240[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar240[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar240[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar240[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar240[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar240[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar240[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar240[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar240[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar240[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar240[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar240[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar240[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar240[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar240[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar240[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar240[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar240[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar240[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar240[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar240[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar240[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar240[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar240[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar240[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar240[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar240[0x3f];
                        local_180 = local_300._0_8_;
                        uStack_178 = local_300._8_8_;
                        uStack_170 = local_300._16_8_;
                        uStack_168 = local_300._24_8_;
                        uStack_160 = local_300._32_8_;
                        uStack_158 = local_300._40_8_;
                        uStack_150 = local_300._48_8_;
                        uStack_148 = local_300._56_8_;
                        auVar240 = vmovdqa64_avx512f(local_340);
                        local_140 = vmovdqa64_avx512f(auVar240);
                        vpcmpeqd_avx2(auVar240._0_32_,auVar240._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = auVar47._0_4_;
                        auVar82 = vmovdqa64_avx512f(local_380);
                        local_400 = vmovdqa64_avx512f(auVar82);
                        local_5f0.valid = (int *)local_400;
                        local_5f0.geometryUserPtr = pGVar6->userPtr;
                        local_5f0.context = context->user;
                        local_5f0.ray = (RTCRayN *)ray;
                        local_5f0.hit = local_2c0;
                        local_5f0.N = 0x10;
                        if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar6->occlusionFilterN)(&local_5f0);
                          auVar243 = ZEXT464(0x3f800000);
                          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar236 = ZEXT1664(auVar33);
                          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar107 = ZEXT1664(auVar33);
                          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar241 = ZEXT1664(auVar33);
                          auVar82 = vmovdqa64_avx512f(local_400);
                        }
                        uVar11 = vptestmd_avx512f(auVar82,auVar82);
                        auVar242._32_32_ = auVar82._32_32_;
                        if ((short)uVar11 == 0) {
                          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar240 = ZEXT1664(auVar33);
                          auVar82._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar237 = ZEXT3264(auVar82._32_32_);
                          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar238 = ZEXT1664(auVar33);
                          auVar242._0_32_ = _DAT_01feed20;
                          auVar239 = ZEXT3264(_DAT_01feed20);
                          auVar83._16_48_ = auVar242._16_48_;
                          auVar83._0_16_ = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
                          auVar242 = ZEXT1664(auVar83._0_16_);
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if (p_Var9 == (RTCFilterFunctionN)0x0) {
                            auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar240 = ZEXT1664(auVar33);
                            auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar237 = ZEXT3264(auVar78);
                            auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar238 = ZEXT1664(auVar33);
                            auVar239 = ZEXT3264(_DAT_01feed20);
                            auVar33 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
                            auVar242 = ZEXT1664(auVar33);
                          }
                          else {
                            auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar240 = ZEXT1664(auVar33);
                            auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar237 = ZEXT3264(auVar78);
                            auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar238 = ZEXT1664(auVar33);
                            auVar239 = ZEXT3264(_DAT_01feed20);
                            auVar33 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
                            auVar242 = ZEXT1664(auVar33);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var9)(&local_5f0);
                              auVar33 = vxorps_avx512vl(auVar33,auVar33);
                              auVar242 = ZEXT1664(auVar33);
                              auVar243 = ZEXT464(0x3f800000);
                              auVar239 = ZEXT3264(_DAT_01feed20);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar238 = ZEXT1664(auVar33);
                              auVar82._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar237 = ZEXT3264(auVar82._32_32_);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar236 = ZEXT1664(auVar33);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar107 = ZEXT1664(auVar33);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar241 = ZEXT1664(auVar33);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar240 = ZEXT1664(auVar33);
                              auVar82 = vmovdqa64_avx512f(local_400);
                            }
                          }
                          uVar21 = vptestmd_avx512f(auVar82,auVar82);
                          auVar82 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar30 = (bool)((byte)uVar21 & 1);
                          auVar83._0_4_ =
                               (uint)bVar30 * auVar82._0_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x200);
                          bVar30 = (bool)((byte)(uVar21 >> 1) & 1);
                          auVar83._4_4_ =
                               (uint)bVar30 * auVar82._4_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x204);
                          bVar30 = (bool)((byte)(uVar21 >> 2) & 1);
                          auVar83._8_4_ =
                               (uint)bVar30 * auVar82._8_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x208);
                          bVar30 = (bool)((byte)(uVar21 >> 3) & 1);
                          auVar83._12_4_ =
                               (uint)bVar30 * auVar82._12_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x20c);
                          bVar30 = (bool)((byte)(uVar21 >> 4) & 1);
                          auVar83._16_4_ =
                               (uint)bVar30 * auVar82._16_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x210);
                          bVar30 = (bool)((byte)(uVar21 >> 5) & 1);
                          auVar83._20_4_ =
                               (uint)bVar30 * auVar82._20_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x214);
                          bVar30 = (bool)((byte)(uVar21 >> 6) & 1);
                          auVar83._24_4_ =
                               (uint)bVar30 * auVar82._24_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x218);
                          bVar30 = (bool)((byte)(uVar21 >> 7) & 1);
                          auVar83._28_4_ =
                               (uint)bVar30 * auVar82._28_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x21c);
                          bVar30 = (bool)((byte)(uVar21 >> 8) & 1);
                          auVar83._32_4_ =
                               (uint)bVar30 * auVar82._32_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x220);
                          bVar30 = (bool)((byte)(uVar21 >> 9) & 1);
                          auVar83._36_4_ =
                               (uint)bVar30 * auVar82._36_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x224);
                          bVar30 = (bool)((byte)(uVar21 >> 10) & 1);
                          auVar83._40_4_ =
                               (uint)bVar30 * auVar82._40_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x228);
                          bVar30 = (bool)((byte)(uVar21 >> 0xb) & 1);
                          auVar83._44_4_ =
                               (uint)bVar30 * auVar82._44_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x22c);
                          bVar30 = (bool)((byte)(uVar21 >> 0xc) & 1);
                          auVar83._48_4_ =
                               (uint)bVar30 * auVar82._48_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x230);
                          bVar30 = (bool)((byte)(uVar21 >> 0xd) & 1);
                          auVar83._52_4_ =
                               (uint)bVar30 * auVar82._52_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x234);
                          bVar30 = (bool)((byte)(uVar21 >> 0xe) & 1);
                          auVar83._56_4_ =
                               (uint)bVar30 * auVar82._56_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x238);
                          bVar30 = SUB81(uVar21 >> 0xf,0);
                          auVar83._60_4_ =
                               (uint)bVar30 * auVar82._60_4_ |
                               (uint)!bVar30 * *(int *)(local_5f0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_5f0.ray + 0x200) = auVar83;
                          bVar24 = 1;
                          if ((short)uVar21 != 0) goto LAB_01ab601b;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar193;
                        goto LAB_01ab6019;
                      }
LAB_01ab601b:
                      bVar18 = (bool)(bVar18 | bVar24);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      goto LAB_01ab50ae;
    }
    auVar110 = vinsertps_avx(auVar48,auVar49,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }